

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-test.c++
# Opt level: O1

void __thiscall kj::_::anon_unknown_0::TestCase168::run(TestCase168 *this)

{
  size_t sVar1;
  bool result;
  byte bVar2;
  anon_union_1_1_a8c68091_for_NullableValue<unsigned_char>_2 aVar3;
  anon_union_2_1_a8c68091_for_NullableValue<unsigned_short>_2 aVar4;
  Maybe<unsigned_char> MVar6;
  Maybe<char> MVar7;
  Maybe<unsigned_short> MVar9;
  ulong uVar10;
  Maybe<int> MVar11;
  Maybe<unsigned_int> MVar12;
  anon_union_8_1_a8c68091_for_NullableValue<double>_2 aVar13;
  bool bVar14;
  anon_union_4_1_a8c68091_for_NullableValue<float>_2 aVar15;
  char *pcVar16;
  char *pcVar17;
  bool bVar18;
  undefined4 uVar19;
  anon_union_4_1_a8c68091_for_NullableValue<float>_2 extraout_XMM0_Da;
  anon_union_4_1_a8c68091_for_NullableValue<float>_2 aVar20;
  undefined4 uVar21;
  Maybe<double> MVar22;
  Maybe<long> MVar23;
  Maybe<unsigned_long> MVar24;
  Maybe<long_long> MVar25;
  Maybe<unsigned_long_long> MVar26;
  DebugComparison<kj::Maybe<double>,_double> _kjCondition;
  undefined1 local_98;
  anon_union_1_1_a8c68091_for_NullableValue<unsigned_char>_2 local_97;
  anon_union_2_1_a8c68091_for_NullableValue<unsigned_short>_2 local_96;
  anon_union_4_1_a8c68091_for_NullableValue<float>_2 local_94;
  anon_union_8_1_a8c68091_for_NullableValue<double>_2 local_90;
  undefined8 local_88;
  char *local_80;
  size_t local_78;
  bool local_70;
  String local_68;
  undefined1 local_50 [2];
  anon_union_2_1_a8c68091_for_NullableValue<unsigned_short>_2 aStack_4e;
  anon_union_4_1_a8c68091_for_NullableValue<float>_2 aStack_4c;
  size_t local_48;
  undefined1 local_40 [8];
  char *local_38;
  Maybe<signed_char> MVar5;
  Maybe<short> MVar8;
  
  _local_50 = "0";
  local_48 = 2;
  MVar22 = StringPtr::tryParseAs<double>((StringPtr *)&local_68);
  uVar19 = MVar22.ptr.field_1._0_4_;
  uVar21 = MVar22.ptr.field_1._4_4_;
  local_98 = (byte)local_68.content.ptr;
  if ((byte)local_68.content.ptr == '\x01') {
    uVar19 = (undefined4)local_68.content.size_;
    uVar21 = (undefined4)(local_68.content.size_ >> 0x20);
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
  }
  if (local_98 == '\0') {
    local_70 = false;
  }
  else {
    local_70 = (bool)(-((double)CONCAT44(uVar21,uVar19) == 0.0) & 1);
    local_90._4_4_ = uVar21;
    local_90._0_4_ = uVar19;
  }
  local_88 = (char *)0x0;
  local_80 = " == ";
  local_78 = 5;
  if ((local_70 == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[52],kj::_::DebugComparison<kj::Maybe<double>,double>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xa9,ERROR,
               "\"failed: expected \" \"\\\"0\\\"_kj.tryParseAs<double>() == 0.0\", _kjCondition",
               (char (*) [52])"failed: expected \"0\"_kj.tryParseAs<double>() == 0.0",
               (DebugComparison<kj::Maybe<double>,_double> *)&local_98);
  }
  _local_50 = "0";
  local_48 = 2;
  MVar22 = StringPtr::tryParseAs<double>((StringPtr *)&local_68);
  uVar19 = MVar22.ptr.field_1._0_4_;
  uVar21 = MVar22.ptr.field_1._4_4_;
  local_98 = (byte)local_68.content.ptr;
  if ((byte)local_68.content.ptr == '\x01') {
    uVar19 = (undefined4)local_68.content.size_;
    uVar21 = (undefined4)(local_68.content.size_ >> 0x20);
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
  }
  if (local_98 == '\0') {
    local_70 = false;
  }
  else {
    local_70 = (bool)(-((double)CONCAT44(uVar21,uVar19) == 0.0) & 1);
    local_90._4_4_ = uVar21;
    local_90._0_4_ = uVar19;
  }
  local_88 = (char *)0x0;
  local_80 = " == ";
  local_78 = 5;
  if ((local_70 == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[52],kj::_::DebugComparison<kj::Maybe<double>,double>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xaa,ERROR,
               "\"failed: expected \" \"\\\"0\\\"_kj.tryParseAs<double>() == 0.0\", _kjCondition",
               (char (*) [52])"failed: expected \"0\"_kj.tryParseAs<double>() == 0.0",
               (DebugComparison<kj::Maybe<double>,_double> *)&local_98);
  }
  _local_50 = "0.0";
  local_48 = 4;
  MVar22 = StringPtr::tryParseAs<double>((StringPtr *)&local_68);
  uVar19 = MVar22.ptr.field_1._0_4_;
  uVar21 = MVar22.ptr.field_1._4_4_;
  local_98 = (byte)local_68.content.ptr;
  if ((byte)local_68.content.ptr == '\x01') {
    uVar19 = (undefined4)local_68.content.size_;
    uVar21 = (undefined4)(local_68.content.size_ >> 0x20);
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
  }
  if (local_98 == '\0') {
    local_70 = false;
  }
  else {
    local_70 = (bool)(-((double)CONCAT44(uVar21,uVar19) == 0.0) & 1);
    local_90._4_4_ = uVar21;
    local_90._0_4_ = uVar19;
  }
  local_88 = (char *)0x0;
  local_80 = " == ";
  local_78 = 5;
  if ((local_70 == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[54],kj::_::DebugComparison<kj::Maybe<double>,double>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xab,ERROR,
               "\"failed: expected \" \"\\\"0.0\\\"_kj.tryParseAs<double>() == 0.0\", _kjCondition",
               (char (*) [54])"failed: expected \"0.0\"_kj.tryParseAs<double>() == 0.0",
               (DebugComparison<kj::Maybe<double>,_double> *)&local_98);
  }
  _local_50 = "1";
  local_48 = 2;
  MVar22 = StringPtr::tryParseAs<double>((StringPtr *)&local_68);
  uVar19 = MVar22.ptr.field_1._0_4_;
  uVar21 = MVar22.ptr.field_1._4_4_;
  local_98 = (byte)local_68.content.ptr;
  if ((byte)local_68.content.ptr == '\x01') {
    uVar19 = (undefined4)local_68.content.size_;
    uVar21 = (undefined4)(local_68.content.size_ >> 0x20);
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
  }
  if (local_98 == '\0') {
    local_70 = false;
  }
  else {
    local_70 = (bool)(-((double)CONCAT44(uVar21,uVar19) == 1.0) & 1);
    local_90._4_4_ = uVar21;
    local_90._0_4_ = uVar19;
  }
  local_88 = (char *)0x3ff0000000000000;
  local_80 = " == ";
  local_78 = 5;
  if ((local_70 == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[52],kj::_::DebugComparison<kj::Maybe<double>,double>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xac,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<double>() == 1.0\", _kjCondition",
               (char (*) [52])"failed: expected \"1\"_kj.tryParseAs<double>() == 1.0",
               (DebugComparison<kj::Maybe<double>,_double> *)&local_98);
  }
  _local_50 = "1.0";
  local_48 = 4;
  MVar22 = StringPtr::tryParseAs<double>((StringPtr *)&local_68);
  uVar19 = MVar22.ptr.field_1._0_4_;
  uVar21 = MVar22.ptr.field_1._4_4_;
  local_98 = (byte)local_68.content.ptr;
  if ((byte)local_68.content.ptr == '\x01') {
    uVar19 = (undefined4)local_68.content.size_;
    uVar21 = (undefined4)(local_68.content.size_ >> 0x20);
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
  }
  if (local_98 == '\0') {
    local_70 = false;
  }
  else {
    local_70 = (bool)(-((double)CONCAT44(uVar21,uVar19) == 1.0) & 1);
    local_90._4_4_ = uVar21;
    local_90._0_4_ = uVar19;
  }
  local_88 = (char *)0x3ff0000000000000;
  local_80 = " == ";
  local_78 = 5;
  if ((local_70 == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[54],kj::_::DebugComparison<kj::Maybe<double>,double>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xad,ERROR,
               "\"failed: expected \" \"\\\"1.0\\\"_kj.tryParseAs<double>() == 1.0\", _kjCondition",
               (char (*) [54])"failed: expected \"1.0\"_kj.tryParseAs<double>() == 1.0",
               (DebugComparison<kj::Maybe<double>,_double> *)&local_98);
  }
  _local_50 = "1e100";
  local_48 = 6;
  MVar22 = StringPtr::tryParseAs<double>((StringPtr *)&local_68);
  uVar19 = MVar22.ptr.field_1._0_4_;
  uVar21 = MVar22.ptr.field_1._4_4_;
  local_98 = (byte)local_68.content.ptr;
  if ((byte)local_68.content.ptr == '\x01') {
    uVar19 = (undefined4)local_68.content.size_;
    uVar21 = (undefined4)(local_68.content.size_ >> 0x20);
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
  }
  if (local_98 == '\0') {
    local_70 = false;
  }
  else {
    local_70 = (bool)(-((double)CONCAT44(uVar21,uVar19) == 1e+100) & 1);
    local_90._4_4_ = uVar21;
    local_90._0_4_ = uVar19;
  }
  local_88 = (char *)0x54b249ad2594c37d;
  local_80 = " == ";
  local_78 = 5;
  if ((local_70 == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[58],kj::_::DebugComparison<kj::Maybe<double>,double>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xae,ERROR,
               "\"failed: expected \" \"\\\"1e100\\\"_kj.tryParseAs<double>() == 1e100\", _kjCondition"
               ,(char (*) [58])"failed: expected \"1e100\"_kj.tryParseAs<double>() == 1e100",
               (DebugComparison<kj::Maybe<double>,_double> *)&local_98);
  }
  _local_50 = "inf";
  local_48 = 4;
  MVar22 = StringPtr::tryParseAs<double>((StringPtr *)&local_68);
  uVar19 = MVar22.ptr.field_1._0_4_;
  uVar21 = MVar22.ptr.field_1._4_4_;
  local_98 = (byte)local_68.content.ptr;
  if ((byte)local_68.content.ptr == '\x01') {
    uVar19 = (undefined4)local_68.content.size_;
    uVar21 = (undefined4)(local_68.content.size_ >> 0x20);
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
  }
  bVar18 = local_98 != '\0';
  if (bVar18) {
    local_90._4_4_ = uVar21;
    local_90._0_4_ = uVar19;
  }
  bVar14 = INFINITY <= (double)CONCAT44(uVar21,uVar19);
  local_70 = bVar18 && bVar14;
  local_88._0_4_ = INFINITY;
  local_80 = " == ";
  local_78 = 5;
  if ((!bVar18 || !bVar14) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[56],kj::_::DebugComparison<kj::Maybe<double>,float>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xaf,ERROR,
               "\"failed: expected \" \"\\\"inf\\\"_kj.tryParseAs<double>() == inf()\", _kjCondition"
               ,(char (*) [56])"failed: expected \"inf\"_kj.tryParseAs<double>() == inf()",
               (DebugComparison<kj::Maybe<double>,_float> *)&local_98);
  }
  _local_50 = "infinity";
  local_48 = 9;
  MVar22 = StringPtr::tryParseAs<double>((StringPtr *)&local_68);
  uVar19 = MVar22.ptr.field_1._0_4_;
  uVar21 = MVar22.ptr.field_1._4_4_;
  local_98 = (byte)local_68.content.ptr;
  if ((byte)local_68.content.ptr == '\x01') {
    uVar19 = (undefined4)local_68.content.size_;
    uVar21 = (undefined4)(local_68.content.size_ >> 0x20);
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
  }
  bVar18 = local_98 != '\0';
  if (bVar18) {
    local_90._4_4_ = uVar21;
    local_90._0_4_ = uVar19;
  }
  bVar14 = INFINITY <= (double)CONCAT44(uVar21,uVar19);
  local_70 = bVar18 && bVar14;
  local_88._0_4_ = INFINITY;
  local_80 = " == ";
  local_78 = 5;
  if ((!bVar18 || !bVar14) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[61],kj::_::DebugComparison<kj::Maybe<double>,float>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xb0,ERROR,
               "\"failed: expected \" \"\\\"infinity\\\"_kj.tryParseAs<double>() == inf()\", _kjCondition"
               ,(char (*) [61])"failed: expected \"infinity\"_kj.tryParseAs<double>() == inf()",
               (DebugComparison<kj::Maybe<double>,_float> *)&local_98);
  }
  _local_50 = "INF";
  local_48 = 4;
  MVar22 = StringPtr::tryParseAs<double>((StringPtr *)&local_68);
  uVar19 = MVar22.ptr.field_1._0_4_;
  uVar21 = MVar22.ptr.field_1._4_4_;
  local_98 = (byte)local_68.content.ptr;
  if ((byte)local_68.content.ptr == '\x01') {
    uVar19 = (undefined4)local_68.content.size_;
    uVar21 = (undefined4)(local_68.content.size_ >> 0x20);
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
  }
  bVar18 = local_98 != '\0';
  if (bVar18) {
    local_90._4_4_ = uVar21;
    local_90._0_4_ = uVar19;
  }
  bVar14 = INFINITY <= (double)CONCAT44(uVar21,uVar19);
  local_70 = bVar18 && bVar14;
  local_88._0_4_ = INFINITY;
  local_80 = " == ";
  local_78 = 5;
  if ((!bVar18 || !bVar14) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[56],kj::_::DebugComparison<kj::Maybe<double>,float>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xb1,ERROR,
               "\"failed: expected \" \"\\\"INF\\\"_kj.tryParseAs<double>() == inf()\", _kjCondition"
               ,(char (*) [56])"failed: expected \"INF\"_kj.tryParseAs<double>() == inf()",
               (DebugComparison<kj::Maybe<double>,_float> *)&local_98);
  }
  _local_50 = "INFINITY";
  local_48 = 9;
  MVar22 = StringPtr::tryParseAs<double>((StringPtr *)&local_68);
  uVar19 = MVar22.ptr.field_1._0_4_;
  uVar21 = MVar22.ptr.field_1._4_4_;
  local_98 = (byte)local_68.content.ptr;
  if ((byte)local_68.content.ptr == '\x01') {
    uVar19 = (undefined4)local_68.content.size_;
    uVar21 = (undefined4)(local_68.content.size_ >> 0x20);
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
  }
  bVar18 = local_98 != '\0';
  if (bVar18) {
    local_90._4_4_ = uVar21;
    local_90._0_4_ = uVar19;
  }
  bVar14 = INFINITY <= (double)CONCAT44(uVar21,uVar19);
  local_70 = bVar18 && bVar14;
  local_88._0_4_ = INFINITY;
  local_80 = " == ";
  local_78 = 5;
  if ((!bVar18 || !bVar14) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[61],kj::_::DebugComparison<kj::Maybe<double>,float>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xb2,ERROR,
               "\"failed: expected \" \"\\\"INFINITY\\\"_kj.tryParseAs<double>() == inf()\", _kjCondition"
               ,(char (*) [61])"failed: expected \"INFINITY\"_kj.tryParseAs<double>() == inf()",
               (DebugComparison<kj::Maybe<double>,_float> *)&local_98);
  }
  _local_50 = "1e100000";
  local_48 = 9;
  MVar22 = StringPtr::tryParseAs<double>((StringPtr *)&local_68);
  uVar19 = MVar22.ptr.field_1._0_4_;
  uVar21 = MVar22.ptr.field_1._4_4_;
  local_98 = (byte)local_68.content.ptr;
  if ((byte)local_68.content.ptr == '\x01') {
    uVar19 = (undefined4)local_68.content.size_;
    uVar21 = (undefined4)(local_68.content.size_ >> 0x20);
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
  }
  bVar18 = local_98 != '\0';
  if (bVar18) {
    local_90._4_4_ = uVar21;
    local_90._0_4_ = uVar19;
  }
  bVar14 = INFINITY <= (double)CONCAT44(uVar21,uVar19);
  local_70 = bVar18 && bVar14;
  local_88._0_4_ = INFINITY;
  local_80 = " == ";
  local_78 = 5;
  if ((!bVar18 || !bVar14) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[61],kj::_::DebugComparison<kj::Maybe<double>,float>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xb3,ERROR,
               "\"failed: expected \" \"\\\"1e100000\\\"_kj.tryParseAs<double>() == inf()\", _kjCondition"
               ,(char (*) [61])"failed: expected \"1e100000\"_kj.tryParseAs<double>() == inf()",
               (DebugComparison<kj::Maybe<double>,_float> *)&local_98);
  }
  _local_50 = "-inf";
  local_48 = 5;
  MVar22 = StringPtr::tryParseAs<double>((StringPtr *)&local_68);
  uVar19 = MVar22.ptr.field_1._0_4_;
  uVar21 = MVar22.ptr.field_1._4_4_;
  local_98 = (byte)local_68.content.ptr;
  if ((byte)local_68.content.ptr == '\x01') {
    uVar19 = (undefined4)local_68.content.size_;
    uVar21 = (undefined4)(local_68.content.size_ >> 0x20);
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
  }
  bVar18 = local_98 != '\0';
  if (bVar18) {
    local_90._4_4_ = uVar21;
    local_90._0_4_ = uVar19;
  }
  bVar14 = (double)CONCAT44(uVar21,uVar19) <= -INFINITY;
  local_70 = bVar18 && bVar14;
  local_88._0_4_ = -INFINITY;
  local_80 = " == ";
  local_78 = 5;
  if ((!bVar18 || !bVar14) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[58],kj::_::DebugComparison<kj::Maybe<double>,float>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xb4,ERROR,
               "\"failed: expected \" \"\\\"-inf\\\"_kj.tryParseAs<double>() == -inf()\", _kjCondition"
               ,(char (*) [58])"failed: expected \"-inf\"_kj.tryParseAs<double>() == -inf()",
               (DebugComparison<kj::Maybe<double>,_float> *)&local_98);
  }
  _local_50 = "-infinity";
  local_48 = 10;
  MVar22 = StringPtr::tryParseAs<double>((StringPtr *)&local_68);
  uVar19 = MVar22.ptr.field_1._0_4_;
  uVar21 = MVar22.ptr.field_1._4_4_;
  local_98 = (byte)local_68.content.ptr;
  if ((byte)local_68.content.ptr == '\x01') {
    uVar19 = (undefined4)local_68.content.size_;
    uVar21 = (undefined4)(local_68.content.size_ >> 0x20);
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
  }
  bVar18 = local_98 != '\0';
  if (bVar18) {
    local_90._4_4_ = uVar21;
    local_90._0_4_ = uVar19;
  }
  bVar14 = (double)CONCAT44(uVar21,uVar19) <= -INFINITY;
  local_70 = bVar18 && bVar14;
  local_88._0_4_ = -INFINITY;
  local_80 = " == ";
  local_78 = 5;
  if ((!bVar18 || !bVar14) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[63],kj::_::DebugComparison<kj::Maybe<double>,float>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xb5,ERROR,
               "\"failed: expected \" \"\\\"-infinity\\\"_kj.tryParseAs<double>() == -inf()\", _kjCondition"
               ,(char (*) [63])"failed: expected \"-infinity\"_kj.tryParseAs<double>() == -inf()",
               (DebugComparison<kj::Maybe<double>,_float> *)&local_98);
  }
  _local_50 = "-INF";
  local_48 = 5;
  MVar22 = StringPtr::tryParseAs<double>((StringPtr *)&local_68);
  uVar19 = MVar22.ptr.field_1._0_4_;
  uVar21 = MVar22.ptr.field_1._4_4_;
  local_98 = (byte)local_68.content.ptr;
  if ((byte)local_68.content.ptr == '\x01') {
    uVar19 = (undefined4)local_68.content.size_;
    uVar21 = (undefined4)(local_68.content.size_ >> 0x20);
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
  }
  bVar18 = local_98 != '\0';
  if (bVar18) {
    local_90._4_4_ = uVar21;
    local_90._0_4_ = uVar19;
  }
  bVar14 = (double)CONCAT44(uVar21,uVar19) <= -INFINITY;
  local_70 = bVar18 && bVar14;
  local_88._0_4_ = -INFINITY;
  local_80 = " == ";
  local_78 = 5;
  if ((!bVar18 || !bVar14) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[58],kj::_::DebugComparison<kj::Maybe<double>,float>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xb6,ERROR,
               "\"failed: expected \" \"\\\"-INF\\\"_kj.tryParseAs<double>() == -inf()\", _kjCondition"
               ,(char (*) [58])"failed: expected \"-INF\"_kj.tryParseAs<double>() == -inf()",
               (DebugComparison<kj::Maybe<double>,_float> *)&local_98);
  }
  _local_50 = "-INFINITY";
  local_48 = 10;
  MVar22 = StringPtr::tryParseAs<double>((StringPtr *)&local_68);
  uVar19 = MVar22.ptr.field_1._0_4_;
  uVar21 = MVar22.ptr.field_1._4_4_;
  local_98 = (byte)local_68.content.ptr;
  if ((byte)local_68.content.ptr == '\x01') {
    uVar19 = (undefined4)local_68.content.size_;
    uVar21 = (undefined4)(local_68.content.size_ >> 0x20);
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
  }
  bVar18 = local_98 != '\0';
  if (bVar18) {
    local_90._4_4_ = uVar21;
    local_90._0_4_ = uVar19;
  }
  bVar14 = (double)CONCAT44(uVar21,uVar19) <= -INFINITY;
  local_70 = bVar18 && bVar14;
  local_88._0_4_ = -INFINITY;
  local_80 = " == ";
  local_78 = 5;
  if ((!bVar18 || !bVar14) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[63],kj::_::DebugComparison<kj::Maybe<double>,float>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xb7,ERROR,
               "\"failed: expected \" \"\\\"-INFINITY\\\"_kj.tryParseAs<double>() == -inf()\", _kjCondition"
               ,(char (*) [63])"failed: expected \"-INFINITY\"_kj.tryParseAs<double>() == -inf()",
               (DebugComparison<kj::Maybe<double>,_float> *)&local_98);
  }
  _local_50 = "-1e100000";
  local_48 = 10;
  MVar22 = StringPtr::tryParseAs<double>((StringPtr *)&local_68);
  uVar19 = MVar22.ptr.field_1._0_4_;
  uVar21 = MVar22.ptr.field_1._4_4_;
  local_98 = (byte)local_68.content.ptr;
  if ((byte)local_68.content.ptr == '\x01') {
    uVar19 = (undefined4)local_68.content.size_;
    uVar21 = (undefined4)(local_68.content.size_ >> 0x20);
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
  }
  bVar18 = local_98 != '\0';
  if (bVar18) {
    local_90._4_4_ = uVar21;
    local_90._0_4_ = uVar19;
  }
  bVar14 = (double)CONCAT44(uVar21,uVar19) <= -INFINITY;
  local_70 = bVar18 && bVar14;
  local_88 = (char *)CONCAT44(local_88._4_4_,0xff800000);
  local_80 = " == ";
  local_78 = 5;
  if ((!bVar18 || !bVar14) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[63],kj::_::DebugComparison<kj::Maybe<double>,float>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xb8,ERROR,
               "\"failed: expected \" \"\\\"-1e100000\\\"_kj.tryParseAs<double>() == -inf()\", _kjCondition"
               ,(char (*) [63])"failed: expected \"-1e100000\"_kj.tryParseAs<double>() == -inf()",
               (DebugComparison<kj::Maybe<double>,_float> *)&local_98);
  }
  _local_50 = "nan";
  local_48 = 4;
  StringPtr::tryParseAs<double>((StringPtr *)&local_68);
  local_98 = NAN((double)local_68.content.size_) & (byte)local_68.content.ptr;
  local_97.value = true;
  local_90.value = 9.3919853605273e-318;
  local_88 = &DAT_00000005;
  local_80._0_1_ = (bool)local_98;
  if (((bool)local_98 == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[77],kj::_::DebugComparison<bool,bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xb9,ERROR,
               "\"failed: expected \" \"isNaN(\\\"nan\\\"_kj.tryParseAs<double>().orDefault(0.0)) == true\", _kjCondition"
               ,(char (*) [77])
                "failed: expected isNaN(\"nan\"_kj.tryParseAs<double>().orDefault(0.0)) == true",
               (DebugComparison<bool,_bool> *)&local_98);
  }
  _local_50 = "NAN";
  local_48 = 4;
  StringPtr::tryParseAs<double>((StringPtr *)&local_68);
  local_98 = NAN((double)local_68.content.size_) & (byte)local_68.content.ptr;
  local_97.value = true;
  local_90.value = 9.3919853605273e-318;
  local_88 = &DAT_00000005;
  local_80._0_1_ = (bool)local_98;
  if (((bool)local_98 == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[77],kj::_::DebugComparison<bool,bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xba,ERROR,
               "\"failed: expected \" \"isNaN(\\\"NAN\\\"_kj.tryParseAs<double>().orDefault(0.0)) == true\", _kjCondition"
               ,(char (*) [77])
                "failed: expected isNaN(\"NAN\"_kj.tryParseAs<double>().orDefault(0.0)) == true",
               (DebugComparison<bool,_bool> *)&local_98);
  }
  _local_50 = "NaN";
  local_48 = 4;
  StringPtr::tryParseAs<double>((StringPtr *)&local_68);
  local_98 = NAN((double)local_68.content.size_) & (byte)local_68.content.ptr;
  local_97.value = true;
  local_90.value = 9.3919853605273e-318;
  local_88 = &DAT_00000005;
  local_80 = (char *)CONCAT71(local_80._1_7_,local_98);
  if (((bool)local_98 == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[77],kj::_::DebugComparison<bool,bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xbb,ERROR,
               "\"failed: expected \" \"isNaN(\\\"NaN\\\"_kj.tryParseAs<double>().orDefault(0.0)) == true\", _kjCondition"
               ,(char (*) [77])
                "failed: expected isNaN(\"NaN\"_kj.tryParseAs<double>().orDefault(0.0)) == true",
               (DebugComparison<bool,_bool> *)&local_98);
  }
  local_38 = "";
  _local_50 = "";
  local_48 = 1;
  MVar22 = StringPtr::tryParseAs<double>((StringPtr *)&local_68);
  uVar19 = MVar22.ptr.field_1._0_4_;
  uVar21 = MVar22.ptr.field_1._4_4_;
  local_98 = (byte)local_68.content.ptr;
  if ((byte)local_68.content.ptr == 1) {
    uVar19 = (undefined4)local_68.content.size_;
    uVar21 = (undefined4)(local_68.content.size_ >> 0x20);
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
  }
  if (local_98 != 0) {
    local_90._4_4_ = uVar21;
    local_90._0_4_ = uVar19;
  }
  local_70 = (bool)(local_98 ^ 1);
  local_88 = &none;
  local_80 = " == ";
  local_78 = 5;
  if ((local_98 != 0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[56],kj::_::DebugComparison<kj::Maybe<double>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xbc,ERROR,
               "\"failed: expected \" \"\\\"\\\"_kj.tryParseAs<double>() == kj::none\", _kjCondition"
               ,(char (*) [56])"failed: expected \"\"_kj.tryParseAs<double>() == kj::none",
               (DebugComparison<kj::Maybe<double>,_const_kj::None_&> *)&local_98);
  }
  _local_50 = "a";
  local_48 = 2;
  MVar22 = StringPtr::tryParseAs<double>((StringPtr *)&local_68);
  uVar19 = MVar22.ptr.field_1._0_4_;
  uVar21 = MVar22.ptr.field_1._4_4_;
  local_98 = (byte)local_68.content.ptr;
  if ((byte)local_68.content.ptr == 1) {
    uVar19 = (undefined4)local_68.content.size_;
    uVar21 = (undefined4)(local_68.content.size_ >> 0x20);
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
  }
  if (local_98 != 0) {
    local_90._4_4_ = uVar21;
    local_90._0_4_ = uVar19;
  }
  local_70 = (bool)(local_98 ^ 1);
  local_88 = &none;
  local_80 = " == ";
  local_78 = 5;
  if ((local_98 != 0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[57],kj::_::DebugComparison<kj::Maybe<double>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xbd,ERROR,
               "\"failed: expected \" \"\\\"a\\\"_kj.tryParseAs<double>() == kj::none\", _kjCondition"
               ,(char (*) [57])"failed: expected \"a\"_kj.tryParseAs<double>() == kj::none",
               (DebugComparison<kj::Maybe<double>,_const_kj::None_&> *)&local_98);
  }
  _local_50 = "1a";
  local_48 = 3;
  MVar22 = StringPtr::tryParseAs<double>((StringPtr *)&local_68);
  uVar19 = MVar22.ptr.field_1._0_4_;
  uVar21 = MVar22.ptr.field_1._4_4_;
  local_98 = (byte)local_68.content.ptr;
  if ((byte)local_68.content.ptr == 1) {
    uVar19 = (undefined4)local_68.content.size_;
    uVar21 = (undefined4)(local_68.content.size_ >> 0x20);
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
  }
  if (local_98 != 0) {
    local_90._4_4_ = uVar21;
    local_90._0_4_ = uVar19;
  }
  local_70 = (bool)(local_98 ^ 1);
  local_88 = &none;
  local_80 = " == ";
  local_78 = 5;
  if ((local_98 != 0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[58],kj::_::DebugComparison<kj::Maybe<double>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xbe,ERROR,
               "\"failed: expected \" \"\\\"1a\\\"_kj.tryParseAs<double>() == kj::none\", _kjCondition"
               ,(char (*) [58])"failed: expected \"1a\"_kj.tryParseAs<double>() == kj::none",
               (DebugComparison<kj::Maybe<double>,_const_kj::None_&> *)&local_98);
  }
  _local_50 = "+-1";
  local_48 = 4;
  MVar22 = StringPtr::tryParseAs<double>((StringPtr *)&local_68);
  uVar19 = MVar22.ptr.field_1._0_4_;
  uVar21 = MVar22.ptr.field_1._4_4_;
  local_98 = (byte)local_68.content.ptr;
  if ((byte)local_68.content.ptr == 1) {
    uVar19 = (undefined4)local_68.content.size_;
    uVar21 = (undefined4)(local_68.content.size_ >> 0x20);
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
  }
  if (local_98 != 0) {
    local_90._4_4_ = uVar21;
    local_90._0_4_ = uVar19;
  }
  local_70 = (bool)(local_98 ^ 1);
  local_88 = &none;
  local_80 = " == ";
  local_78 = 5;
  if ((local_98 != 0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[59],kj::_::DebugComparison<kj::Maybe<double>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xbf,ERROR,
               "\"failed: expected \" \"\\\"+-1\\\"_kj.tryParseAs<double>() == kj::none\", _kjCondition"
               ,(char (*) [59])"failed: expected \"+-1\"_kj.tryParseAs<double>() == kj::none",
               (DebugComparison<kj::Maybe<double>,_const_kj::None_&> *)&local_98);
  }
  local_68.content.ptr = "1";
  local_68.content.size_ = 2;
  StringPtr::tryParseAs<float>((StringPtr *)local_50);
  local_98 = local_50[0];
  aVar20 = extraout_XMM0_Da;
  if (local_50[0] == '\x01') {
    aVar20 = aStack_4c;
    _local_50 = (char *)((ulong)_local_50 & 0xffffffffffffff00);
  }
  if (local_98 == '\0') {
    bVar2 = 0;
  }
  else {
    bVar2 = -(aVar20.value == 1.0) & 1;
    local_94 = aVar20;
  }
  local_90.value = 1.0;
  local_88 = " == ";
  local_80 = &DAT_00000005;
  local_78 = CONCAT71(local_78._1_7_,bVar2);
  if ((bVar2 == 0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[51],kj::_::DebugComparison<kj::Maybe<float>,double>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xc1,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<float>() == 1.0\", _kjCondition",
               (char (*) [51])"failed: expected \"1\"_kj.tryParseAs<float>() == 1.0",
               (DebugComparison<kj::Maybe<float>,_double> *)&local_98);
  }
  _local_50 = "1";
  local_48 = 2;
  MVar23 = StringPtr::tryParseAs<long>((StringPtr *)&local_68);
  local_98 = (byte)local_68.content.ptr;
  aVar13 = MVar23.ptr._0_8_;
  if ((byte)local_68.content.ptr == '\x01') {
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
    aVar13 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_68.content.size_;
  }
  bVar18 = local_98 != '\0';
  if (bVar18) {
    local_90 = aVar13;
  }
  local_70 = bVar18 && aVar13 == (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x1;
  local_88 = (char *)CONCAT44(local_88._4_4_,1);
  local_80 = " == ";
  local_78 = 5;
  if ((!bVar18 || aVar13 != (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x1) &&
     (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[51],kj::_::DebugComparison<kj::Maybe<long>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xc3,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<int64_t>() == 1\", _kjCondition",
               (char (*) [51])"failed: expected \"1\"_kj.tryParseAs<int64_t>() == 1",
               (DebugComparison<kj::Maybe<long>,_int> *)&local_98);
  }
  _local_50 = "9223372036854775807";
  local_48 = 0x14;
  MVar23 = StringPtr::tryParseAs<long>((StringPtr *)&local_68);
  local_98 = (byte)local_68.content.ptr;
  aVar13 = MVar23.ptr._0_8_;
  if ((byte)local_68.content.ptr == '\x01') {
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
    aVar13 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_68.content.size_;
  }
  bVar18 = local_98 != '\0';
  if (bVar18) {
    local_90 = aVar13;
  }
  local_70 = bVar18 && aVar13 == (anon_union_8_1_a8c68091_for_NullableValue<double>_2)
                                 0x7fffffffffffffff;
  local_88 = (char *)0x7fffffffffffffff;
  local_80 = " == ";
  local_78 = 5;
  if ((!bVar18 || aVar13 != (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x7fffffffffffffff)
     && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[89],kj::_::DebugComparison<kj::Maybe<long>,long_long>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xc4,ERROR,
               "\"failed: expected \" \"\\\"9223372036854775807\\\"_kj.tryParseAs<int64_t>() == 9223372036854775807LL\", _kjCondition"
               ,(char (*) [89])
                "failed: expected \"9223372036854775807\"_kj.tryParseAs<int64_t>() == 9223372036854775807LL"
               ,(DebugComparison<kj::Maybe<long>,_long_long> *)&local_98);
  }
  _local_50 = "-9223372036854775808";
  local_48 = 0x15;
  MVar23 = StringPtr::tryParseAs<long>((StringPtr *)&local_68);
  local_98 = (byte)local_68.content.ptr;
  aVar13 = MVar23.ptr._0_8_;
  if ((byte)local_68.content.ptr == '\x01') {
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
    aVar13 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_68.content.size_;
  }
  if (local_98 == '\0') {
    pcVar16 = (char *)0x0;
  }
  else {
    pcVar16._1_7_ = 0x80000000000000;
    pcVar16._0_1_ =
         aVar13 == (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x8000000000000000;
    local_90 = aVar13;
  }
  local_88 = (char *)0x8000000000000000;
  local_80 = " == ";
  local_78 = 5;
  local_70 = SUB81(pcVar16,0);
  if ((local_70 == false) && (Debug::minSeverity < 3)) {
    pcVar16 = 
    "\"failed: expected \" \"\\\"-9223372036854775808\\\"_kj.tryParseAs<int64_t>() == -9223372036854775808ULL\", _kjCondition"
    ;
    Debug::log<char_const(&)[92],kj::_::DebugComparison<kj::Maybe<long>,unsigned_long_long>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xc5,ERROR,
               "\"failed: expected \" \"\\\"-9223372036854775808\\\"_kj.tryParseAs<int64_t>() == -9223372036854775808ULL\", _kjCondition"
               ,(char (*) [92])
                "failed: expected \"-9223372036854775808\"_kj.tryParseAs<int64_t>() == -9223372036854775808ULL"
               ,(DebugComparison<kj::Maybe<long>,_unsigned_long_long> *)&local_98);
  }
  _local_50 = "9223372036854775808";
  local_48 = 0x14;
  MVar23 = StringPtr::tryParseAs<long>((StringPtr *)&local_68);
  local_98 = (byte)local_68.content.ptr;
  uVar10 = CONCAT71(MVar23.ptr._1_7_,(byte)local_68.content.ptr);
  if ((byte)local_68.content.ptr == '\x01') {
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
    pcVar16 = (char *)local_68.content.size_;
  }
  if (local_98 != '\0') {
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)pcVar16;
  }
  pcVar16 = (char *)(uVar10 & 0xffffffff ^ 1);
  local_88 = &none;
  local_80 = " == ";
  local_78 = 5;
  local_70 = SUB81(pcVar16,0);
  if ((local_98 != '\0') && (Debug::minSeverity < 3)) {
    pcVar16 = 
    "\"failed: expected \" \"\\\"9223372036854775808\\\"_kj.tryParseAs<int64_t>() == kj::none\", _kjCondition"
    ;
    Debug::log<char_const(&)[76],kj::_::DebugComparison<kj::Maybe<long>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xc6,ERROR,
               "\"failed: expected \" \"\\\"9223372036854775808\\\"_kj.tryParseAs<int64_t>() == kj::none\", _kjCondition"
               ,(char (*) [76])
                "failed: expected \"9223372036854775808\"_kj.tryParseAs<int64_t>() == kj::none",
               (DebugComparison<kj::Maybe<long>,_const_kj::None_&> *)&local_98);
  }
  _local_50 = "-9223372036854775809";
  local_48 = 0x15;
  MVar23 = StringPtr::tryParseAs<long>((StringPtr *)&local_68);
  local_98 = (byte)local_68.content.ptr;
  uVar10 = CONCAT71(MVar23.ptr._1_7_,(byte)local_68.content.ptr);
  if ((byte)local_68.content.ptr == '\x01') {
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
    pcVar16 = (char *)local_68.content.size_;
  }
  if (local_98 != '\0') {
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)pcVar16;
  }
  pcVar16 = (char *)(uVar10 & 0xffffffff ^ 1);
  local_88 = &none;
  local_80 = " == ";
  local_78 = 5;
  local_70 = SUB81(pcVar16,0);
  if ((local_98 != '\0') && (Debug::minSeverity < 3)) {
    pcVar16 = 
    "\"failed: expected \" \"\\\"-9223372036854775809\\\"_kj.tryParseAs<int64_t>() == kj::none\", _kjCondition"
    ;
    Debug::log<char_const(&)[77],kj::_::DebugComparison<kj::Maybe<long>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,199,ERROR,
               "\"failed: expected \" \"\\\"-9223372036854775809\\\"_kj.tryParseAs<int64_t>() == kj::none\", _kjCondition"
               ,(char (*) [77])
                "failed: expected \"-9223372036854775809\"_kj.tryParseAs<int64_t>() == kj::none",
               (DebugComparison<kj::Maybe<long>,_const_kj::None_&> *)&local_98);
  }
  _local_50 = "";
  local_48 = 1;
  MVar23 = StringPtr::tryParseAs<long>((StringPtr *)&local_68);
  local_98 = (byte)local_68.content.ptr;
  uVar10 = CONCAT71(MVar23.ptr._1_7_,(byte)local_68.content.ptr);
  if ((byte)local_68.content.ptr == '\x01') {
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
    pcVar16 = (char *)local_68.content.size_;
  }
  if (local_98 != '\0') {
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)pcVar16;
  }
  pcVar16 = (char *)(uVar10 & 0xffffffff ^ 1);
  local_88 = &none;
  local_80 = " == ";
  local_78 = 5;
  local_70 = SUB81(pcVar16,0);
  if ((local_98 != '\0') && (Debug::minSeverity < 3)) {
    pcVar16 = 
    "\"failed: expected \" \"\\\"\\\"_kj.tryParseAs<int64_t>() == kj::none\", _kjCondition";
    Debug::log<char_const(&)[57],kj::_::DebugComparison<kj::Maybe<long>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,200,ERROR,
               "\"failed: expected \" \"\\\"\\\"_kj.tryParseAs<int64_t>() == kj::none\", _kjCondition"
               ,(char (*) [57])"failed: expected \"\"_kj.tryParseAs<int64_t>() == kj::none",
               (DebugComparison<kj::Maybe<long>,_const_kj::None_&> *)&local_98);
  }
  _local_50 = "a";
  local_48 = 2;
  MVar23 = StringPtr::tryParseAs<long>((StringPtr *)&local_68);
  local_98 = (byte)local_68.content.ptr;
  uVar10 = CONCAT71(MVar23.ptr._1_7_,(byte)local_68.content.ptr);
  if ((byte)local_68.content.ptr == '\x01') {
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
    pcVar16 = (char *)local_68.content.size_;
  }
  if (local_98 != '\0') {
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)pcVar16;
  }
  pcVar16 = (char *)(uVar10 & 0xffffffff ^ 1);
  local_88 = &none;
  local_80 = " == ";
  local_78 = 5;
  local_70 = SUB81(pcVar16,0);
  if ((local_98 != '\0') && (Debug::minSeverity < 3)) {
    pcVar16 = 
    "\"failed: expected \" \"\\\"a\\\"_kj.tryParseAs<int64_t>() == kj::none\", _kjCondition";
    Debug::log<char_const(&)[58],kj::_::DebugComparison<kj::Maybe<long>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xc9,ERROR,
               "\"failed: expected \" \"\\\"a\\\"_kj.tryParseAs<int64_t>() == kj::none\", _kjCondition"
               ,(char (*) [58])"failed: expected \"a\"_kj.tryParseAs<int64_t>() == kj::none",
               (DebugComparison<kj::Maybe<long>,_const_kj::None_&> *)&local_98);
  }
  _local_50 = "1a";
  local_48 = 3;
  MVar23 = StringPtr::tryParseAs<long>((StringPtr *)&local_68);
  local_98 = (byte)local_68.content.ptr;
  uVar10 = CONCAT71(MVar23.ptr._1_7_,(byte)local_68.content.ptr);
  if ((byte)local_68.content.ptr == '\x01') {
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
    pcVar16 = (char *)local_68.content.size_;
  }
  if (local_98 != '\0') {
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)pcVar16;
  }
  pcVar16 = (char *)(uVar10 & 0xffffffff ^ 1);
  local_88 = &none;
  local_80 = " == ";
  local_78 = 5;
  local_70 = SUB81(pcVar16,0);
  if ((local_98 != '\0') && (Debug::minSeverity < 3)) {
    pcVar16 = 
    "\"failed: expected \" \"\\\"1a\\\"_kj.tryParseAs<int64_t>() == kj::none\", _kjCondition";
    Debug::log<char_const(&)[59],kj::_::DebugComparison<kj::Maybe<long>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xca,ERROR,
               "\"failed: expected \" \"\\\"1a\\\"_kj.tryParseAs<int64_t>() == kj::none\", _kjCondition"
               ,(char (*) [59])"failed: expected \"1a\"_kj.tryParseAs<int64_t>() == kj::none",
               (DebugComparison<kj::Maybe<long>,_const_kj::None_&> *)&local_98);
  }
  _local_50 = "+-1";
  local_48 = 4;
  MVar23 = StringPtr::tryParseAs<long>((StringPtr *)&local_68);
  local_98 = (byte)local_68.content.ptr;
  uVar10 = CONCAT71(MVar23.ptr._1_7_,(byte)local_68.content.ptr);
  if ((byte)local_68.content.ptr == '\x01') {
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
    pcVar16 = (char *)local_68.content.size_;
  }
  if (local_98 != '\0') {
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)pcVar16;
  }
  pcVar16 = (char *)(uVar10 & 0xffffffff ^ 1);
  local_88 = &none;
  local_80 = " == ";
  local_78 = 5;
  local_70 = SUB81(pcVar16,0);
  if ((local_98 != '\0') && (Debug::minSeverity < 3)) {
    pcVar16 = 
    "\"failed: expected \" \"\\\"+-1\\\"_kj.tryParseAs<int64_t>() == kj::none\", _kjCondition";
    Debug::log<char_const(&)[60],kj::_::DebugComparison<kj::Maybe<long>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xcb,ERROR,
               "\"failed: expected \" \"\\\"+-1\\\"_kj.tryParseAs<int64_t>() == kj::none\", _kjCondition"
               ,(char (*) [60])"failed: expected \"+-1\"_kj.tryParseAs<int64_t>() == kj::none",
               (DebugComparison<kj::Maybe<long>,_const_kj::None_&> *)&local_98);
  }
  _local_50 = "010";
  local_48 = 4;
  MVar23 = StringPtr::tryParseAs<long>((StringPtr *)&local_68);
  local_98 = (byte)local_68.content.ptr;
  aVar13 = MVar23.ptr._0_8_;
  if ((byte)local_68.content.ptr == '\x01') {
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
    aVar13 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_68.content.size_;
  }
  if (local_98 == '\0') {
    pcVar16 = (char *)0x0;
  }
  else {
    pcVar16 = (char *)CONCAT71((int7)((ulong)pcVar16 >> 8),
                               aVar13 == (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0xa);
    local_90 = aVar13;
  }
  local_88._0_4_ = 1.4013e-44;
  local_80 = " == ";
  local_78 = 5;
  local_70 = SUB81(pcVar16,0);
  if ((local_70 == false) && (Debug::minSeverity < 3)) {
    pcVar16 = "\"failed: expected \" \"\\\"010\\\"_kj.tryParseAs<int64_t>() == 10\", _kjCondition";
    Debug::log<char_const(&)[54],kj::_::DebugComparison<kj::Maybe<long>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xcc,ERROR,
               "\"failed: expected \" \"\\\"010\\\"_kj.tryParseAs<int64_t>() == 10\", _kjCondition",
               (char (*) [54])"failed: expected \"010\"_kj.tryParseAs<int64_t>() == 10",
               (DebugComparison<kj::Maybe<long>,_int> *)&local_98);
  }
  _local_50 = "0010";
  local_48 = 5;
  MVar23 = StringPtr::tryParseAs<long>((StringPtr *)&local_68);
  local_98 = (byte)local_68.content.ptr;
  aVar13 = MVar23.ptr._0_8_;
  if ((byte)local_68.content.ptr == '\x01') {
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
    aVar13 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_68.content.size_;
  }
  if (local_98 == '\0') {
    pcVar16 = (char *)0x0;
  }
  else {
    pcVar16 = (char *)CONCAT71((int7)((ulong)pcVar16 >> 8),
                               aVar13 == (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0xa);
    local_90 = aVar13;
  }
  local_88._0_4_ = 1.4013e-44;
  local_80 = " == ";
  local_78 = 5;
  local_70 = SUB81(pcVar16,0);
  if ((local_70 == false) && (Debug::minSeverity < 3)) {
    pcVar16 = "\"failed: expected \" \"\\\"0010\\\"_kj.tryParseAs<int64_t>() == 10\", _kjCondition";
    Debug::log<char_const(&)[55],kj::_::DebugComparison<kj::Maybe<long>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xcd,ERROR,
               "\"failed: expected \" \"\\\"0010\\\"_kj.tryParseAs<int64_t>() == 10\", _kjCondition"
               ,(char (*) [55])"failed: expected \"0010\"_kj.tryParseAs<int64_t>() == 10",
               (DebugComparison<kj::Maybe<long>,_int> *)&local_98);
  }
  _local_50 = "0x10";
  local_48 = 5;
  MVar23 = StringPtr::tryParseAs<long>((StringPtr *)&local_68);
  local_98 = (byte)local_68.content.ptr;
  aVar13 = MVar23.ptr._0_8_;
  if ((byte)local_68.content.ptr == '\x01') {
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
    aVar13 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_68.content.size_;
  }
  if (local_98 == '\0') {
    pcVar16 = (char *)0x0;
  }
  else {
    pcVar16 = (char *)CONCAT71((int7)((ulong)pcVar16 >> 8),
                               aVar13 == (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x10);
    local_90 = aVar13;
  }
  local_88._0_4_ = 2.24208e-44;
  local_80 = " == ";
  local_78 = 5;
  local_70 = SUB81(pcVar16,0);
  if ((local_70 == false) && (Debug::minSeverity < 3)) {
    pcVar16 = "\"failed: expected \" \"\\\"0x10\\\"_kj.tryParseAs<int64_t>() == 16\", _kjCondition";
    Debug::log<char_const(&)[55],kj::_::DebugComparison<kj::Maybe<long>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xce,ERROR,
               "\"failed: expected \" \"\\\"0x10\\\"_kj.tryParseAs<int64_t>() == 16\", _kjCondition"
               ,(char (*) [55])"failed: expected \"0x10\"_kj.tryParseAs<int64_t>() == 16",
               (DebugComparison<kj::Maybe<long>,_int> *)&local_98);
  }
  _local_50 = "0X10";
  local_48 = 5;
  MVar23 = StringPtr::tryParseAs<long>((StringPtr *)&local_68);
  local_98 = (byte)local_68.content.ptr;
  aVar13 = MVar23.ptr._0_8_;
  if ((byte)local_68.content.ptr == '\x01') {
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
    aVar13 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_68.content.size_;
  }
  if (local_98 == '\0') {
    pcVar16 = (char *)0x0;
  }
  else {
    pcVar16 = (char *)CONCAT71((int7)((ulong)pcVar16 >> 8),
                               aVar13 == (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x10);
    local_90 = aVar13;
  }
  local_88._0_4_ = 2.24208e-44;
  local_80 = " == ";
  local_78 = 5;
  local_70 = SUB81(pcVar16,0);
  if ((local_70 == false) && (Debug::minSeverity < 3)) {
    pcVar16 = "\"failed: expected \" \"\\\"0X10\\\"_kj.tryParseAs<int64_t>() == 16\", _kjCondition";
    Debug::log<char_const(&)[55],kj::_::DebugComparison<kj::Maybe<long>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xcf,ERROR,
               "\"failed: expected \" \"\\\"0X10\\\"_kj.tryParseAs<int64_t>() == 16\", _kjCondition"
               ,(char (*) [55])"failed: expected \"0X10\"_kj.tryParseAs<int64_t>() == 16",
               (DebugComparison<kj::Maybe<long>,_int> *)&local_98);
  }
  _local_50 = "-010";
  local_48 = 5;
  MVar23 = StringPtr::tryParseAs<long>((StringPtr *)&local_68);
  local_98 = (byte)local_68.content.ptr;
  aVar13 = MVar23.ptr._0_8_;
  if ((byte)local_68.content.ptr == '\x01') {
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
    aVar13 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_68.content.size_;
  }
  if (local_98 == '\0') {
    pcVar16 = (char *)0x0;
  }
  else {
    pcVar16 = (char *)CONCAT71((int7)((ulong)pcVar16 >> 8),
                               aVar13 == (anon_union_8_1_a8c68091_for_NullableValue<double>_2)
                                         0xfffffffffffffff6);
    local_90 = aVar13;
  }
  local_88._0_4_ = -NAN;
  local_80 = " == ";
  local_78 = 5;
  local_70 = SUB81(pcVar16,0);
  if ((local_70 == false) && (Debug::minSeverity < 3)) {
    pcVar16 = "\"failed: expected \" \"\\\"-010\\\"_kj.tryParseAs<int64_t>() == -10\", _kjCondition"
    ;
    Debug::log<char_const(&)[56],kj::_::DebugComparison<kj::Maybe<long>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xd0,ERROR,
               "\"failed: expected \" \"\\\"-010\\\"_kj.tryParseAs<int64_t>() == -10\", _kjCondition"
               ,(char (*) [56])"failed: expected \"-010\"_kj.tryParseAs<int64_t>() == -10",
               (DebugComparison<kj::Maybe<long>,_int> *)&local_98);
  }
  _local_50 = "-0x10";
  local_48 = 6;
  MVar23 = StringPtr::tryParseAs<long>((StringPtr *)&local_68);
  local_98 = (byte)local_68.content.ptr;
  aVar13 = MVar23.ptr._0_8_;
  if ((byte)local_68.content.ptr == '\x01') {
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
    aVar13 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_68.content.size_;
  }
  if (local_98 == '\0') {
    pcVar16 = (char *)0x0;
  }
  else {
    pcVar16 = (char *)CONCAT71((int7)((ulong)pcVar16 >> 8),
                               aVar13 == (anon_union_8_1_a8c68091_for_NullableValue<double>_2)
                                         0xfffffffffffffff0);
    local_90 = aVar13;
  }
  local_88._0_4_ = -NAN;
  local_80 = " == ";
  local_78 = 5;
  local_70 = SUB81(pcVar16,0);
  if ((local_70 == false) && (Debug::minSeverity < 3)) {
    pcVar16 = 
    "\"failed: expected \" \"\\\"-0x10\\\"_kj.tryParseAs<int64_t>() == -16\", _kjCondition";
    Debug::log<char_const(&)[57],kj::_::DebugComparison<kj::Maybe<long>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xd1,ERROR,
               "\"failed: expected \" \"\\\"-0x10\\\"_kj.tryParseAs<int64_t>() == -16\", _kjCondition"
               ,(char (*) [57])"failed: expected \"-0x10\"_kj.tryParseAs<int64_t>() == -16",
               (DebugComparison<kj::Maybe<long>,_int> *)&local_98);
  }
  _local_50 = "-0X10";
  local_48 = 6;
  MVar23 = StringPtr::tryParseAs<long>((StringPtr *)&local_68);
  local_98 = (byte)local_68.content.ptr;
  aVar13 = MVar23.ptr._0_8_;
  if ((byte)local_68.content.ptr == '\x01') {
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
    aVar13 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_68.content.size_;
  }
  if (local_98 == '\0') {
    pcVar16 = (char *)0x0;
  }
  else {
    pcVar16 = (char *)CONCAT71((int7)((ulong)pcVar16 >> 8),
                               aVar13 == (anon_union_8_1_a8c68091_for_NullableValue<double>_2)
                                         0xfffffffffffffff0);
    local_90 = aVar13;
  }
  local_88._0_4_ = -NAN;
  local_80 = " == ";
  local_78 = 5;
  local_70 = SUB81(pcVar16,0);
  if ((local_70 == false) && (Debug::minSeverity < 3)) {
    pcVar16 = 
    "\"failed: expected \" \"\\\"-0X10\\\"_kj.tryParseAs<int64_t>() == -16\", _kjCondition";
    Debug::log<char_const(&)[57],kj::_::DebugComparison<kj::Maybe<long>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xd2,ERROR,
               "\"failed: expected \" \"\\\"-0X10\\\"_kj.tryParseAs<int64_t>() == -16\", _kjCondition"
               ,(char (*) [57])"failed: expected \"-0X10\"_kj.tryParseAs<int64_t>() == -16",
               (DebugComparison<kj::Maybe<long>,_int> *)&local_98);
  }
  _local_50 = "1";
  local_48 = 2;
  MVar24 = StringPtr::tryParseAs<unsigned_long>((StringPtr *)&local_68);
  local_98 = (byte)local_68.content.ptr;
  aVar13 = MVar24.ptr._0_8_;
  if ((byte)local_68.content.ptr == '\x01') {
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
    aVar13 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_68.content.size_;
  }
  if (local_98 == '\0') {
    pcVar16 = (char *)0x0;
  }
  else {
    pcVar16 = (char *)CONCAT71((int7)((ulong)pcVar16 >> 8),
                               aVar13 == (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x1);
    local_90 = aVar13;
  }
  local_88._0_4_ = 1.4013e-45;
  local_80 = " == ";
  local_78 = 5;
  local_70 = SUB81(pcVar16,0);
  if ((local_70 == false) && (Debug::minSeverity < 3)) {
    pcVar16 = "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<uint64_t>() == 1\", _kjCondition";
    Debug::log<char_const(&)[52],kj::_::DebugComparison<kj::Maybe<unsigned_long>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xd4,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<uint64_t>() == 1\", _kjCondition",
               (char (*) [52])"failed: expected \"1\"_kj.tryParseAs<uint64_t>() == 1",
               (DebugComparison<kj::Maybe<unsigned_long>,_int> *)&local_98);
  }
  _local_50 = "0";
  local_48 = 2;
  MVar24 = StringPtr::tryParseAs<unsigned_long>((StringPtr *)&local_68);
  local_98 = (byte)local_68.content.ptr;
  aVar13 = MVar24.ptr._0_8_;
  if ((byte)local_68.content.ptr == '\x01') {
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
    aVar13 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_68.content.size_;
  }
  if (local_98 == '\0') {
    pcVar16 = (char *)0x0;
  }
  else {
    pcVar16 = (char *)CONCAT71((int7)((ulong)pcVar16 >> 8),
                               aVar13 == (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x0);
    local_90 = aVar13;
  }
  local_88 = (char *)((ulong)local_88._4_4_ << 0x20);
  local_80 = " == ";
  local_78 = 5;
  local_70 = SUB81(pcVar16,0);
  if ((local_70 == false) && (Debug::minSeverity < 3)) {
    pcVar16 = "\"failed: expected \" \"\\\"0\\\"_kj.tryParseAs<uint64_t>() == 0\", _kjCondition";
    Debug::log<char_const(&)[52],kj::_::DebugComparison<kj::Maybe<unsigned_long>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xd5,ERROR,
               "\"failed: expected \" \"\\\"0\\\"_kj.tryParseAs<uint64_t>() == 0\", _kjCondition",
               (char (*) [52])"failed: expected \"0\"_kj.tryParseAs<uint64_t>() == 0",
               (DebugComparison<kj::Maybe<unsigned_long>,_int> *)&local_98);
  }
  _local_50 = "18446744073709551615";
  local_48 = 0x15;
  MVar24 = StringPtr::tryParseAs<unsigned_long>((StringPtr *)&local_68);
  local_98 = (byte)local_68.content.ptr;
  pcVar17._1_7_ = (undefined7)((ulong)pcVar16 >> 8);
  aVar13 = MVar24.ptr._0_8_;
  if ((byte)local_68.content.ptr == '\x01') {
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
    aVar13 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_68.content.size_;
  }
  if (local_98 == '\0') {
    pcVar17 = (char *)0x0;
  }
  else {
    pcVar17._0_1_ =
         aVar13 == (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0xffffffffffffffff;
    local_90 = aVar13;
  }
  local_88 = (char *)0xffffffffffffffff;
  local_80 = " == ";
  local_78 = 5;
  local_70 = SUB81(pcVar17,0);
  if ((local_70 == false) && (Debug::minSeverity < 3)) {
    pcVar17 = 
    "\"failed: expected \" \"\\\"18446744073709551615\\\"_kj.tryParseAs<uint64_t>() == 18446744073709551615ULL\", _kjCondition"
    ;
    Debug::
    log<char_const(&)[93],kj::_::DebugComparison<kj::Maybe<unsigned_long>,unsigned_long_long>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xd6,ERROR,
               "\"failed: expected \" \"\\\"18446744073709551615\\\"_kj.tryParseAs<uint64_t>() == 18446744073709551615ULL\", _kjCondition"
               ,(char (*) [93])
                "failed: expected \"18446744073709551615\"_kj.tryParseAs<uint64_t>() == 18446744073709551615ULL"
               ,(DebugComparison<kj::Maybe<unsigned_long>,_unsigned_long_long> *)&local_98);
  }
  _local_50 = "-1";
  local_48 = 3;
  MVar24 = StringPtr::tryParseAs<unsigned_long>((StringPtr *)&local_68);
  local_98 = (byte)local_68.content.ptr;
  uVar10 = CONCAT71(MVar24.ptr._1_7_,(byte)local_68.content.ptr);
  if ((byte)local_68.content.ptr == '\x01') {
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
    pcVar17 = (char *)local_68.content.size_;
  }
  if (local_98 != '\0') {
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)pcVar17;
  }
  pcVar16 = (char *)(uVar10 & 0xffffffff ^ 1);
  local_88 = &none;
  local_80 = " == ";
  local_78 = 5;
  local_70 = SUB81(pcVar16,0);
  if ((local_98 != '\0') && (Debug::minSeverity < 3)) {
    pcVar16 = 
    "\"failed: expected \" \"\\\"-1\\\"_kj.tryParseAs<uint64_t>() == kj::none\", _kjCondition";
    Debug::log<char_const(&)[60],kj::_::DebugComparison<kj::Maybe<unsigned_long>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xd7,ERROR,
               "\"failed: expected \" \"\\\"-1\\\"_kj.tryParseAs<uint64_t>() == kj::none\", _kjCondition"
               ,(char (*) [60])"failed: expected \"-1\"_kj.tryParseAs<uint64_t>() == kj::none",
               (DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> *)&local_98);
  }
  _local_50 = "18446744073709551616";
  local_48 = 0x15;
  MVar24 = StringPtr::tryParseAs<unsigned_long>((StringPtr *)&local_68);
  local_98 = (byte)local_68.content.ptr;
  uVar10 = CONCAT71(MVar24.ptr._1_7_,(byte)local_68.content.ptr);
  if ((byte)local_68.content.ptr == '\x01') {
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
    pcVar16 = (char *)local_68.content.size_;
  }
  if (local_98 != '\0') {
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)pcVar16;
  }
  pcVar16 = (char *)(uVar10 & 0xffffffff ^ 1);
  local_88 = &none;
  local_80 = " == ";
  local_78 = 5;
  local_70 = SUB81(pcVar16,0);
  if ((local_98 != '\0') && (Debug::minSeverity < 3)) {
    pcVar16 = 
    "\"failed: expected \" \"\\\"18446744073709551616\\\"_kj.tryParseAs<uint64_t>() == kj::none\", _kjCondition"
    ;
    Debug::log<char_const(&)[78],kj::_::DebugComparison<kj::Maybe<unsigned_long>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xd8,ERROR,
               "\"failed: expected \" \"\\\"18446744073709551616\\\"_kj.tryParseAs<uint64_t>() == kj::none\", _kjCondition"
               ,(char (*) [78])
                "failed: expected \"18446744073709551616\"_kj.tryParseAs<uint64_t>() == kj::none",
               (DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> *)&local_98);
  }
  _local_50 = "";
  local_48 = 1;
  MVar24 = StringPtr::tryParseAs<unsigned_long>((StringPtr *)&local_68);
  local_98 = (byte)local_68.content.ptr;
  uVar10 = CONCAT71(MVar24.ptr._1_7_,(byte)local_68.content.ptr);
  if ((byte)local_68.content.ptr == '\x01') {
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
    pcVar16 = (char *)local_68.content.size_;
  }
  if (local_98 != '\0') {
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)pcVar16;
  }
  pcVar16 = (char *)(uVar10 & 0xffffffff ^ 1);
  local_88 = &none;
  local_80 = " == ";
  local_78 = 5;
  local_70 = SUB81(pcVar16,0);
  if ((local_98 != '\0') && (Debug::minSeverity < 3)) {
    pcVar16 = 
    "\"failed: expected \" \"\\\"\\\"_kj.tryParseAs<uint64_t>() == kj::none\", _kjCondition";
    Debug::log<char_const(&)[58],kj::_::DebugComparison<kj::Maybe<unsigned_long>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xd9,ERROR,
               "\"failed: expected \" \"\\\"\\\"_kj.tryParseAs<uint64_t>() == kj::none\", _kjCondition"
               ,(char (*) [58])"failed: expected \"\"_kj.tryParseAs<uint64_t>() == kj::none",
               (DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> *)&local_98);
  }
  _local_50 = "a";
  local_48 = 2;
  MVar24 = StringPtr::tryParseAs<unsigned_long>((StringPtr *)&local_68);
  local_98 = (byte)local_68.content.ptr;
  uVar10 = CONCAT71(MVar24.ptr._1_7_,(byte)local_68.content.ptr);
  if ((byte)local_68.content.ptr == '\x01') {
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
    pcVar16 = (char *)local_68.content.size_;
  }
  if (local_98 != '\0') {
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)pcVar16;
  }
  pcVar16 = (char *)(uVar10 & 0xffffffff ^ 1);
  local_88 = &none;
  local_80 = " == ";
  local_78 = 5;
  local_70 = SUB81(pcVar16,0);
  if ((local_98 != '\0') && (Debug::minSeverity < 3)) {
    pcVar16 = 
    "\"failed: expected \" \"\\\"a\\\"_kj.tryParseAs<uint64_t>() == kj::none\", _kjCondition";
    Debug::log<char_const(&)[59],kj::_::DebugComparison<kj::Maybe<unsigned_long>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xda,ERROR,
               "\"failed: expected \" \"\\\"a\\\"_kj.tryParseAs<uint64_t>() == kj::none\", _kjCondition"
               ,(char (*) [59])"failed: expected \"a\"_kj.tryParseAs<uint64_t>() == kj::none",
               (DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> *)&local_98);
  }
  _local_50 = "1a";
  local_48 = 3;
  MVar24 = StringPtr::tryParseAs<unsigned_long>((StringPtr *)&local_68);
  local_98 = (byte)local_68.content.ptr;
  uVar10 = CONCAT71(MVar24.ptr._1_7_,(byte)local_68.content.ptr);
  if ((byte)local_68.content.ptr == '\x01') {
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
    pcVar16 = (char *)local_68.content.size_;
  }
  if (local_98 != '\0') {
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)pcVar16;
  }
  pcVar16 = (char *)(uVar10 & 0xffffffff ^ 1);
  local_88 = &none;
  local_80 = " == ";
  local_78 = 5;
  local_70 = SUB81(pcVar16,0);
  if ((local_98 != '\0') && (Debug::minSeverity < 3)) {
    pcVar16 = 
    "\"failed: expected \" \"\\\"1a\\\"_kj.tryParseAs<uint64_t>() == kj::none\", _kjCondition";
    Debug::log<char_const(&)[60],kj::_::DebugComparison<kj::Maybe<unsigned_long>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xdb,ERROR,
               "\"failed: expected \" \"\\\"1a\\\"_kj.tryParseAs<uint64_t>() == kj::none\", _kjCondition"
               ,(char (*) [60])"failed: expected \"1a\"_kj.tryParseAs<uint64_t>() == kj::none",
               (DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> *)&local_98);
  }
  _local_50 = "+-1";
  local_48 = 4;
  StringPtr::tryParseAs<unsigned_long>((StringPtr *)&local_68);
  local_98 = (byte)local_68.content.ptr;
  if ((byte)local_68.content.ptr == 1) {
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
    pcVar16 = (char *)local_68.content.size_;
  }
  if (local_98 != 0) {
    local_90 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)pcVar16;
  }
  local_70 = (bool)(local_98 ^ 1);
  local_88 = &none;
  local_80 = " == ";
  local_78 = 5;
  if ((local_98 != 0) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[61],kj::_::DebugComparison<kj::Maybe<unsigned_long>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xdc,ERROR,
               "\"failed: expected \" \"\\\"+-1\\\"_kj.tryParseAs<uint64_t>() == kj::none\", _kjCondition"
               ,(char (*) [61])"failed: expected \"+-1\"_kj.tryParseAs<uint64_t>() == kj::none",
               (DebugComparison<kj::Maybe<unsigned_long>,_const_kj::None_&> *)&local_98);
  }
  local_68.content.ptr = "1";
  local_68.content.size_ = 2;
  MVar11 = StringPtr::tryParseAs<int>((StringPtr *)local_50);
  aVar20 = MVar11.ptr._0_4_;
  local_98 = local_50[0];
  if (local_50[0] == '\x01') {
    aVar20 = aStack_4c;
    _local_50 = (char *)((ulong)_local_50 & 0xffffffffffffff00);
  }
  bVar18 = local_98 != '\0';
  if (bVar18) {
    local_94 = aVar20;
  }
  bVar14 = bVar18 && aVar20 == (anon_union_4_1_a8c68091_for_NullableValue<float>_2)0x1;
  local_90._0_4_ = 1;
  local_88 = " == ";
  local_80 = &DAT_00000005;
  local_78._0_1_ = bVar14;
  if ((!bVar18 || aVar20 != (anon_union_4_1_a8c68091_for_NullableValue<float>_2)0x1) &&
     (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[51],kj::_::DebugComparison<kj::Maybe<int>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xde,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<int32_t>() == 1\", _kjCondition",
               (char (*) [51])"failed: expected \"1\"_kj.tryParseAs<int32_t>() == 1",
               (DebugComparison<kj::Maybe<int>,_int> *)&local_98);
  }
  local_68.content.ptr = "2147483647";
  local_68.content.size_ = 0xb;
  MVar11 = StringPtr::tryParseAs<int>((StringPtr *)local_50);
  aVar20 = MVar11.ptr._0_4_;
  local_98 = local_50[0];
  if (local_50[0] == '\x01') {
    aVar20 = aStack_4c;
    _local_50 = (char *)((ulong)_local_50 & 0xffffffffffffff00);
  }
  bVar18 = local_98 != '\0';
  if (bVar18) {
    local_94 = aVar20;
  }
  local_78._0_1_ =
       bVar18 && aVar20 == (anon_union_4_1_a8c68091_for_NullableValue<float>_2)0x7fffffff;
  local_90._0_4_ = 0x7fffffff;
  local_88 = " == ";
  local_80 = &DAT_00000005;
  if ((!bVar18 || aVar20 != (anon_union_4_1_a8c68091_for_NullableValue<float>_2)0x7fffffff) &&
     (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[69],kj::_::DebugComparison<kj::Maybe<int>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xdf,ERROR,
               "\"failed: expected \" \"\\\"2147483647\\\"_kj.tryParseAs<int32_t>() == 2147483647\", _kjCondition"
               ,(char (*) [69])
                "failed: expected \"2147483647\"_kj.tryParseAs<int32_t>() == 2147483647",
               (DebugComparison<kj::Maybe<int>,_int> *)&local_98);
  }
  local_68.content.ptr = "-2147483648";
  local_68.content.size_ = 0xc;
  MVar11 = StringPtr::tryParseAs<int>((StringPtr *)local_50);
  aVar20 = MVar11.ptr._0_4_;
  local_98 = local_50[0];
  if (local_50[0] == '\x01') {
    aVar20 = aStack_4c;
    _local_50 = (char *)((ulong)_local_50 & 0xffffffffffffff00);
  }
  if (local_98 == '\0') {
    aVar15.value = 0.0;
  }
  else {
    aVar15 = (anon_union_4_1_a8c68091_for_NullableValue<float>_2)(-(int)aVar20 & 0xffffff00);
    local_94 = aVar20;
  }
  local_90.value = -NAN;
  local_88 = " == ";
  local_80 = &DAT_00000005;
  local_78._0_1_ = false;
  if (Debug::minSeverity < 3) {
    aVar15.value = 2.737019e-39;
    Debug::log<char_const(&)[71],kj::_::DebugComparison<kj::Maybe<int>,long>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xe0,ERROR,
               "\"failed: expected \" \"\\\"-2147483648\\\"_kj.tryParseAs<int32_t>() == -2147483648\", _kjCondition"
               ,(char (*) [71])
                "failed: expected \"-2147483648\"_kj.tryParseAs<int32_t>() == -2147483648",
               (DebugComparison<kj::Maybe<int>,_long> *)&local_98);
  }
  local_68.content.ptr = "2147483648";
  local_68.content.size_ = 0xb;
  MVar11 = StringPtr::tryParseAs<int>((StringPtr *)local_50);
  local_98 = local_50[0];
  uVar10 = CONCAT71(MVar11.ptr._1_7_,local_50[0]);
  if (local_50[0] == '\x01') {
    aVar15 = aStack_4c;
    _local_50 = (char *)((ulong)_local_50 & 0xffffffffffffff00);
  }
  if (local_98 != '\0') {
    local_94 = aVar15;
  }
  uVar10 = uVar10 & 0xffffffff ^ 1;
  aVar20 = SUB84(uVar10,0);
  local_90.value = (double)&none;
  local_88 = " == ";
  local_80 = &DAT_00000005;
  local_78._0_1_ = (undefined1)uVar10;
  if ((local_98 != '\0') && (Debug::minSeverity < 3)) {
    aVar20.value = 2.737247e-39;
    Debug::log<char_const(&)[67],kj::_::DebugComparison<kj::Maybe<int>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xe1,ERROR,
               "\"failed: expected \" \"\\\"2147483648\\\"_kj.tryParseAs<int32_t>() == kj::none\", _kjCondition"
               ,(char (*) [67])
                "failed: expected \"2147483648\"_kj.tryParseAs<int32_t>() == kj::none",
               (DebugComparison<kj::Maybe<int>,_const_kj::None_&> *)&local_98);
  }
  local_68.content.ptr = "-2147483649";
  local_68.content.size_ = 0xc;
  MVar11 = StringPtr::tryParseAs<int>((StringPtr *)local_50);
  local_98 = local_50[0];
  uVar10 = CONCAT71(MVar11.ptr._1_7_,local_50[0]);
  if (local_50[0] == '\x01') {
    aVar20 = aStack_4c;
    _local_50 = (char *)((ulong)_local_50 & 0xffffffffffffff00);
  }
  if (local_98 != '\0') {
    local_94 = aVar20;
  }
  pcVar16 = (char *)(uVar10 & 0xffffffff ^ 1);
  local_90.value = (double)&none;
  local_88 = " == ";
  local_80 = &DAT_00000005;
  local_78._0_1_ = SUB81(pcVar16,0);
  if ((local_98 != '\0') && (Debug::minSeverity < 3)) {
    pcVar16 = 
    "\"failed: expected \" \"\\\"-2147483649\\\"_kj.tryParseAs<int32_t>() == kj::none\", _kjCondition"
    ;
    Debug::log<char_const(&)[68],kj::_::DebugComparison<kj::Maybe<int>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xe2,ERROR,
               "\"failed: expected \" \"\\\"-2147483649\\\"_kj.tryParseAs<int32_t>() == kj::none\", _kjCondition"
               ,(char (*) [68])
                "failed: expected \"-2147483649\"_kj.tryParseAs<int32_t>() == kj::none",
               (DebugComparison<kj::Maybe<int>,_const_kj::None_&> *)&local_98);
  }
  local_68.content.ptr = "1";
  local_68.content.size_ = 2;
  MVar12 = StringPtr::tryParseAs<unsigned_int>((StringPtr *)local_50);
  aVar20 = MVar12.ptr._0_4_;
  local_98 = local_50[0];
  if (local_50[0] == '\x01') {
    aVar20 = aStack_4c;
    _local_50 = (char *)((ulong)_local_50 & 0xffffffffffffff00);
  }
  if (local_98 == '\0') {
    pcVar16 = (char *)0x0;
  }
  else {
    pcVar16 = (char *)CONCAT71((int7)((ulong)pcVar16 >> 8),
                               aVar20 == (anon_union_4_1_a8c68091_for_NullableValue<float>_2)0x1);
    local_94 = aVar20;
  }
  local_90._0_4_ = 1;
  local_88 = " == ";
  local_80 = &DAT_00000005;
  local_78._0_1_ = SUB81(pcVar16,0);
  if (((bool)(undefined1)local_78 == false) && (Debug::minSeverity < 3)) {
    pcVar16 = "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<uint32_t>() == 1\", _kjCondition";
    Debug::log<char_const(&)[52],kj::_::DebugComparison<kj::Maybe<unsigned_int>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xe4,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<uint32_t>() == 1\", _kjCondition",
               (char (*) [52])"failed: expected \"1\"_kj.tryParseAs<uint32_t>() == 1",
               (DebugComparison<kj::Maybe<unsigned_int>,_int> *)&local_98);
  }
  local_68.content.ptr = "0";
  local_68.content.size_ = 2;
  MVar12 = StringPtr::tryParseAs<unsigned_int>((StringPtr *)local_50);
  aVar20 = MVar12.ptr._0_4_;
  local_98 = local_50[0];
  if (local_50[0] == '\x01') {
    aVar20 = aStack_4c;
    _local_50 = (char *)((ulong)_local_50 & 0xffffffffffffff00);
  }
  if (local_98 == '\0') {
    pcVar16 = (char *)0x0;
  }
  else {
    pcVar16 = (char *)CONCAT71((int7)((ulong)pcVar16 >> 8),
                               aVar20 == (anon_union_4_1_a8c68091_for_NullableValue<float>_2)0x0);
    local_94 = aVar20;
  }
  local_90._0_4_ = 0;
  local_88 = " == ";
  local_80 = &DAT_00000005;
  local_78._0_1_ = SUB81(pcVar16,0);
  if (((bool)(undefined1)local_78 == false) && (Debug::minSeverity < 3)) {
    pcVar16 = "\"failed: expected \" \"\\\"0\\\"_kj.tryParseAs<uint32_t>() == 0U\", _kjCondition";
    Debug::log<char_const(&)[53],kj::_::DebugComparison<kj::Maybe<unsigned_int>,unsigned_int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xe5,ERROR,
               "\"failed: expected \" \"\\\"0\\\"_kj.tryParseAs<uint32_t>() == 0U\", _kjCondition",
               (char (*) [53])"failed: expected \"0\"_kj.tryParseAs<uint32_t>() == 0U",
               (DebugComparison<kj::Maybe<unsigned_int>,_unsigned_int> *)&local_98);
  }
  local_68.content.ptr = "4294967295";
  local_68.content.size_ = 0xb;
  MVar12 = StringPtr::tryParseAs<unsigned_int>((StringPtr *)local_50);
  aVar20 = MVar12.ptr._0_4_;
  local_98 = local_50[0];
  if (local_50[0] == '\x01') {
    aVar20 = aStack_4c;
    _local_50 = (char *)((ulong)_local_50 & 0xffffffffffffff00);
  }
  if (local_98 == '\0') {
    aVar15.value = 0.0;
  }
  else {
    aVar15 = SUB84(CONCAT71((int7)((ulong)pcVar16 >> 8),
                            aVar20 == (anon_union_4_1_a8c68091_for_NullableValue<float>_2)0xffffffff
                           ),0);
    local_94 = aVar20;
  }
  local_90._0_4_ = 0xffffffff;
  local_88 = " == ";
  local_80 = &DAT_00000005;
  local_78._0_1_ = aVar15._0_1_;
  if (((bool)(undefined1)local_78 == false) && (Debug::minSeverity < 3)) {
    aVar15.value = 2.738038e-39;
    Debug::log<char_const(&)[71],kj::_::DebugComparison<kj::Maybe<unsigned_int>,unsigned_int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xe6,ERROR,
               "\"failed: expected \" \"\\\"4294967295\\\"_kj.tryParseAs<uint32_t>() == 4294967295U\", _kjCondition"
               ,(char (*) [71])
                "failed: expected \"4294967295\"_kj.tryParseAs<uint32_t>() == 4294967295U",
               (DebugComparison<kj::Maybe<unsigned_int>,_unsigned_int> *)&local_98);
  }
  local_68.content.ptr = "-1";
  local_68.content.size_ = 3;
  MVar12 = StringPtr::tryParseAs<unsigned_int>((StringPtr *)local_50);
  local_98 = local_50[0];
  uVar10 = CONCAT71(MVar12.ptr._1_7_,local_50[0]);
  if (local_50[0] == '\x01') {
    aVar15 = aStack_4c;
    _local_50 = (char *)((ulong)_local_50 & 0xffffffffffffff00);
  }
  if (local_98 != '\0') {
    local_94 = aVar15;
  }
  uVar10 = uVar10 & 0xffffffff ^ 1;
  aVar20 = SUB84(uVar10,0);
  local_90.value = (double)&none;
  local_88 = " == ";
  local_80 = &DAT_00000005;
  local_78._0_1_ = (undefined1)uVar10;
  if ((local_98 != '\0') && (Debug::minSeverity < 3)) {
    aVar20.value = 2.738266e-39;
    Debug::log<char_const(&)[60],kj::_::DebugComparison<kj::Maybe<unsigned_int>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xe7,ERROR,
               "\"failed: expected \" \"\\\"-1\\\"_kj.tryParseAs<uint32_t>() == kj::none\", _kjCondition"
               ,(char (*) [60])"failed: expected \"-1\"_kj.tryParseAs<uint32_t>() == kj::none",
               (DebugComparison<kj::Maybe<unsigned_int>,_const_kj::None_&> *)&local_98);
  }
  local_68.content.ptr = "4294967296";
  local_68.content.size_ = 0xb;
  StringPtr::tryParseAs<unsigned_int>((StringPtr *)local_50);
  local_98 = local_50[0];
  if (local_50[0] == '\x01') {
    aVar20 = aStack_4c;
    _local_50 = (char *)((ulong)_local_50 & 0xffffffffffffff00);
  }
  if (local_98 != '\0') {
    local_94 = aVar20;
  }
  local_90.value = (double)&none;
  local_88 = " == ";
  local_80 = &DAT_00000005;
  local_78 = CONCAT71(local_78._1_7_,local_98) ^ 1;
  if ((local_98 != '\0') && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[68],kj::_::DebugComparison<kj::Maybe<unsigned_int>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xe8,ERROR,
               "\"failed: expected \" \"\\\"4294967296\\\"_kj.tryParseAs<uint32_t>() == kj::none\", _kjCondition"
               ,(char (*) [68])
                "failed: expected \"4294967296\"_kj.tryParseAs<uint32_t>() == kj::none",
               (DebugComparison<kj::Maybe<unsigned_int>,_const_kj::None_&> *)&local_98);
  }
  local_68.content.ptr = "1";
  local_68.content.size_ = 2;
  MVar8 = StringPtr::tryParseAs<short>((StringPtr *)local_50);
  aVar4.value = MVar8.ptr._0_2_;
  local_98 = local_50[0];
  if (local_50[0] == '\x01') {
    aVar4.value = aStack_4e.value;
    _local_50 = (char *)((ulong)_local_50 & 0xffffffffffffff00);
  }
  bVar18 = local_98 != '\0';
  if (bVar18) {
    local_96 = aVar4;
  }
  bVar14 = bVar18 && aVar4.value == 1;
  local_94.value = 1.4013e-45;
  local_90.value = 9.3919853605273e-318;
  local_88 = &DAT_00000005;
  local_80._0_1_ = bVar14;
  if ((!bVar18 || aVar4.value != 1) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[51],kj::_::DebugComparison<kj::Maybe<short>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xea,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<int16_t>() == 1\", _kjCondition",
               (char (*) [51])"failed: expected \"1\"_kj.tryParseAs<int16_t>() == 1",
               (DebugComparison<kj::Maybe<short>,_int> *)&local_98);
  }
  local_68.content.ptr = "1";
  local_68.content.size_ = 2;
  MVar9 = StringPtr::tryParseAs<unsigned_short>((StringPtr *)local_50);
  aVar4.value = MVar9.ptr._0_2_;
  local_98 = local_50[0];
  if (local_50[0] == '\x01') {
    aVar4.value = aStack_4e.value;
    _local_50 = (char *)((ulong)_local_50 & 0xffffffffffffff00);
  }
  bVar18 = local_98 != '\0';
  if (bVar18) {
    local_96 = aVar4;
  }
  local_80._0_1_ = bVar18 && aVar4.value == 1;
  local_94.value = 1.4013e-45;
  local_90.value = 9.3919853605273e-318;
  local_88 = &DAT_00000005;
  if ((!bVar18 || aVar4.value != 1) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[52],kj::_::DebugComparison<kj::Maybe<unsigned_short>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xeb,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<uint16_t>() == 1\", _kjCondition",
               (char (*) [52])"failed: expected \"1\"_kj.tryParseAs<uint16_t>() == 1",
               (DebugComparison<kj::Maybe<unsigned_short>,_int> *)&local_98);
  }
  local_68.content.ptr = "1";
  local_68.content.size_ = 2;
  MVar5 = StringPtr::tryParseAs<signed_char>((StringPtr *)local_50);
  aVar3.value = MVar5.ptr.isSet;
  local_98 = local_50[0];
  if (local_50[0] == '\x01') {
    aVar3.value = local_50[1];
    _local_50 = (char *)((ulong)_local_50 & 0xffffffffffffff00);
  }
  bVar18 = local_98 != '\0';
  if (bVar18) {
    local_97 = aVar3;
  }
  local_80._0_1_ = bVar18 && aVar3.value == '\x01';
  local_94.value = 1.4013e-45;
  local_90.value = 9.3919853605273e-318;
  local_88 = &DAT_00000005;
  if ((!bVar18 || aVar3.value != '\x01') && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[50],kj::_::DebugComparison<kj::Maybe<signed_char>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xec,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<int8_t>() == 1\", _kjCondition",
               (char (*) [50])"failed: expected \"1\"_kj.tryParseAs<int8_t>() == 1",
               (DebugComparison<kj::Maybe<signed_char>,_int> *)&local_98);
  }
  local_68.content.ptr = "1";
  local_68.content.size_ = 2;
  MVar6 = StringPtr::tryParseAs<unsigned_char>((StringPtr *)local_50);
  aVar3.value = MVar6.ptr.isSet;
  local_98 = local_50[0];
  if (local_50[0] == '\x01') {
    aVar3.value = local_50[1];
    _local_50 = (char *)((ulong)_local_50 & 0xffffffffffffff00);
  }
  bVar18 = local_98 != '\0';
  if (bVar18) {
    local_97 = aVar3;
  }
  local_80._0_1_ = bVar18 && aVar3.value == '\x01';
  local_94.value = 1.4013e-45;
  local_90.value = 9.3919853605273e-318;
  local_88 = &DAT_00000005;
  if ((!bVar18 || aVar3.value != '\x01') && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[51],kj::_::DebugComparison<kj::Maybe<unsigned_char>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xed,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<uint8_t>() == 1\", _kjCondition",
               (char (*) [51])"failed: expected \"1\"_kj.tryParseAs<uint8_t>() == 1",
               (DebugComparison<kj::Maybe<unsigned_char>,_int> *)&local_98);
  }
  local_68.content.ptr = "1";
  local_68.content.size_ = 2;
  MVar7 = StringPtr::tryParseAs<char>((StringPtr *)local_50);
  aVar3.value = MVar7.ptr.isSet;
  local_98 = local_50[0];
  if (local_50[0] == '\x01') {
    aVar3.value = local_50[1];
    _local_50 = (char *)((ulong)_local_50 & 0xffffffffffffff00);
  }
  bVar18 = local_98 != '\0';
  if (bVar18) {
    local_97 = aVar3;
  }
  local_80._0_1_ = bVar18 && aVar3.value == '\x01';
  local_94.value = 1.4013e-45;
  local_90.value = 9.3919853605273e-318;
  local_88 = &DAT_00000005;
  if ((!bVar18 || aVar3.value != '\x01') && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[48],kj::_::DebugComparison<kj::Maybe<char>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xee,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<char>() == 1\", _kjCondition",
               (char (*) [48])"failed: expected \"1\"_kj.tryParseAs<char>() == 1",
               (DebugComparison<kj::Maybe<char>,_int> *)&local_98);
  }
  local_68.content.ptr = "1";
  local_68.content.size_ = 2;
  MVar5 = StringPtr::tryParseAs<signed_char>((StringPtr *)local_50);
  aVar3.value = MVar5.ptr.isSet;
  local_98 = local_50[0];
  if (local_50[0] == '\x01') {
    aVar3.value = local_50[1];
    _local_50 = (char *)((ulong)_local_50 & 0xffffffffffffff00);
  }
  bVar18 = local_98 != '\0';
  if (bVar18) {
    local_97 = aVar3;
  }
  local_80._0_1_ = bVar18 && aVar3.value == '\x01';
  local_94.value = 1.4013e-45;
  local_90.value = 9.3919853605273e-318;
  local_88 = &DAT_00000005;
  if ((!bVar18 || aVar3.value != '\x01') && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[55],kj::_::DebugComparison<kj::Maybe<signed_char>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xef,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<signed char>() == 1\", _kjCondition"
               ,(char (*) [55])"failed: expected \"1\"_kj.tryParseAs<signed char>() == 1",
               (DebugComparison<kj::Maybe<signed_char>,_int> *)&local_98);
  }
  local_68.content.ptr = "1";
  local_68.content.size_ = 2;
  MVar6 = StringPtr::tryParseAs<unsigned_char>((StringPtr *)local_50);
  aVar3.value = MVar6.ptr.isSet;
  local_98 = local_50[0];
  if (local_50[0] == '\x01') {
    aVar3.value = local_50[1];
    _local_50 = (char *)((ulong)_local_50 & 0xffffffffffffff00);
  }
  bVar18 = local_98 != '\0';
  if (bVar18) {
    local_97 = aVar3;
  }
  local_80._0_1_ = bVar18 && aVar3.value == '\x01';
  local_94.value = 1.4013e-45;
  local_90.value = 9.3919853605273e-318;
  local_88 = &DAT_00000005;
  if ((!bVar18 || aVar3.value != '\x01') && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[57],kj::_::DebugComparison<kj::Maybe<unsigned_char>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xf0,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<unsigned char>() == 1\", _kjCondition"
               ,(char (*) [57])"failed: expected \"1\"_kj.tryParseAs<unsigned char>() == 1",
               (DebugComparison<kj::Maybe<unsigned_char>,_int> *)&local_98);
  }
  local_68.content.ptr = "1";
  local_68.content.size_ = 2;
  MVar8 = StringPtr::tryParseAs<short>((StringPtr *)local_50);
  aVar4.value = MVar8.ptr._0_2_;
  local_98 = local_50[0];
  if (local_50[0] == '\x01') {
    aVar4.value = aStack_4e.value;
    _local_50 = (char *)((ulong)_local_50 & 0xffffffffffffff00);
  }
  bVar18 = local_98 != '\0';
  if (bVar18) {
    local_96 = aVar4;
  }
  local_80._0_1_ = bVar18 && aVar4.value == 1;
  local_94.value = 1.4013e-45;
  local_90.value = 9.3919853605273e-318;
  local_88 = &DAT_00000005;
  if ((!bVar18 || aVar4.value != 1) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[49],kj::_::DebugComparison<kj::Maybe<short>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xf1,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<short>() == 1\", _kjCondition",
               (char (*) [49])"failed: expected \"1\"_kj.tryParseAs<short>() == 1",
               (DebugComparison<kj::Maybe<short>,_int> *)&local_98);
  }
  local_68.content.ptr = "1";
  local_68.content.size_ = 2;
  MVar9 = StringPtr::tryParseAs<unsigned_short>((StringPtr *)local_50);
  aVar4.value = MVar9.ptr._0_2_;
  local_98 = local_50[0];
  if (local_50[0] == '\x01') {
    aVar4.value = aStack_4e.value;
    _local_50 = (char *)((ulong)_local_50 & 0xffffffffffffff00);
  }
  bVar18 = local_98 != '\0';
  if (bVar18) {
    local_96 = aVar4;
  }
  local_94.value = 1.4013e-45;
  local_90.value = 9.3919853605273e-318;
  local_88 = &DAT_00000005;
  local_80 = (char *)CONCAT71(local_80._1_7_,bVar18 && aVar4.value == 1);
  if ((!bVar18 || aVar4.value != 1) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[58],kj::_::DebugComparison<kj::Maybe<unsigned_short>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xf2,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<unsigned short>() == 1\", _kjCondition"
               ,(char (*) [58])"failed: expected \"1\"_kj.tryParseAs<unsigned short>() == 1",
               (DebugComparison<kj::Maybe<unsigned_short>,_int> *)&local_98);
  }
  local_68.content.ptr = "1";
  local_68.content.size_ = 2;
  MVar11 = StringPtr::tryParseAs<int>((StringPtr *)local_50);
  aVar20 = MVar11.ptr._0_4_;
  local_98 = local_50[0];
  if (local_50[0] == '\x01') {
    aVar20 = aStack_4c;
    _local_50 = (char *)((ulong)_local_50 & 0xffffffffffffff00);
  }
  bVar18 = local_98 != '\0';
  if (bVar18) {
    local_94 = aVar20;
  }
  bVar14 = bVar18 && aVar20 == (anon_union_4_1_a8c68091_for_NullableValue<float>_2)0x1;
  local_90._0_4_ = 1;
  local_88 = " == ";
  local_80 = &DAT_00000005;
  local_78._0_1_ = bVar14;
  if ((!bVar18 || aVar20 != (anon_union_4_1_a8c68091_for_NullableValue<float>_2)0x1) &&
     (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[47],kj::_::DebugComparison<kj::Maybe<int>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xf3,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<int>() == 1\", _kjCondition",
               (char (*) [47])"failed: expected \"1\"_kj.tryParseAs<int>() == 1",
               (DebugComparison<kj::Maybe<int>,_int> *)&local_98);
  }
  local_68.content.ptr = "1";
  local_68.content.size_ = 2;
  MVar12 = StringPtr::tryParseAs<unsigned_int>((StringPtr *)local_50);
  aVar20 = MVar12.ptr._0_4_;
  local_98 = local_50[0];
  if (local_50[0] == '\x01') {
    aVar20 = aStack_4c;
    _local_50 = (char *)((ulong)_local_50 & 0xffffffffffffff00);
  }
  bVar18 = local_98 != '\0';
  if (bVar18) {
    local_94 = aVar20;
  }
  local_90._0_4_ = 1;
  local_88 = " == ";
  local_80 = &DAT_00000005;
  local_78 = CONCAT71(local_78._1_7_,
                      bVar18 && aVar20 == (anon_union_4_1_a8c68091_for_NullableValue<float>_2)0x1);
  if ((!bVar18 || aVar20 != (anon_union_4_1_a8c68091_for_NullableValue<float>_2)0x1) &&
     (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[52],kj::_::DebugComparison<kj::Maybe<unsigned_int>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xf4,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<unsigned>() == 1\", _kjCondition",
               (char (*) [52])"failed: expected \"1\"_kj.tryParseAs<unsigned>() == 1",
               (DebugComparison<kj::Maybe<unsigned_int>,_int> *)&local_98);
  }
  _local_50 = "1";
  local_48 = 2;
  MVar23 = StringPtr::tryParseAs<long>((StringPtr *)&local_68);
  local_98 = (byte)local_68.content.ptr;
  aVar13 = MVar23.ptr._0_8_;
  if ((byte)local_68.content.ptr == '\x01') {
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
    aVar13 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_68.content.size_;
  }
  bVar18 = local_98 != '\0';
  if (bVar18) {
    local_90 = aVar13;
  }
  local_70 = bVar18 && aVar13 == (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x1;
  local_88._0_4_ = 1.4013e-45;
  local_80 = " == ";
  local_78 = 5;
  if ((!bVar18 || aVar13 != (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x1) &&
     (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[48],kj::_::DebugComparison<kj::Maybe<long>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xf5,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<long>() == 1\", _kjCondition",
               (char (*) [48])"failed: expected \"1\"_kj.tryParseAs<long>() == 1",
               (DebugComparison<kj::Maybe<long>,_int> *)&local_98);
  }
  _local_50 = "1";
  local_48 = 2;
  MVar24 = StringPtr::tryParseAs<unsigned_long>((StringPtr *)&local_68);
  local_98 = (byte)local_68.content.ptr;
  aVar13 = MVar24.ptr._0_8_;
  if ((byte)local_68.content.ptr == '\x01') {
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
    aVar13 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_68.content.size_;
  }
  bVar18 = local_98 != '\0';
  if (bVar18) {
    local_90 = aVar13;
  }
  local_70 = bVar18 && aVar13 == (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x1;
  local_88._0_4_ = 1.4013e-45;
  local_80 = " == ";
  local_78 = 5;
  if ((!bVar18 || aVar13 != (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x1) &&
     (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[57],kj::_::DebugComparison<kj::Maybe<unsigned_long>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xf6,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<unsigned long>() == 1\", _kjCondition"
               ,(char (*) [57])"failed: expected \"1\"_kj.tryParseAs<unsigned long>() == 1",
               (DebugComparison<kj::Maybe<unsigned_long>,_int> *)&local_98);
  }
  _local_50 = "1";
  local_48 = 2;
  MVar25 = StringPtr::tryParseAs<long_long>((StringPtr *)&local_68);
  local_98 = (byte)local_68.content.ptr;
  aVar13 = MVar25.ptr._0_8_;
  if ((byte)local_68.content.ptr == '\x01') {
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
    aVar13 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_68.content.size_;
  }
  bVar18 = local_98 != '\0';
  if (bVar18) {
    local_90 = aVar13;
  }
  local_70 = bVar18 && aVar13 == (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x1;
  local_88._0_4_ = 1.4013e-45;
  local_80 = " == ";
  local_78 = 5;
  if ((!bVar18 || aVar13 != (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x1) &&
     (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[53],kj::_::DebugComparison<kj::Maybe<long_long>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xf7,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<long long>() == 1\", _kjCondition",
               (char (*) [53])"failed: expected \"1\"_kj.tryParseAs<long long>() == 1",
               (DebugComparison<kj::Maybe<long_long>,_int> *)&local_98);
  }
  _local_50 = "1";
  local_48 = 2;
  MVar26 = StringPtr::tryParseAs<unsigned_long_long>((StringPtr *)&local_68);
  local_98 = (byte)local_68.content.ptr;
  aVar13 = MVar26.ptr._0_8_;
  if ((byte)local_68.content.ptr == '\x01') {
    local_68.content.ptr = (char *)((ulong)local_68.content.ptr & 0xffffffffffffff00);
    aVar13 = (anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_68.content.size_;
  }
  bVar18 = local_98 != '\0';
  if (bVar18) {
    local_90 = aVar13;
  }
  local_70 = bVar18 && aVar13 == (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x1;
  local_88 = (char *)CONCAT44(local_88._4_4_,1);
  local_80 = " == ";
  local_78 = 5;
  if ((!bVar18 || aVar13 != (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x1) &&
     (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[62],kj::_::DebugComparison<kj::Maybe<unsigned_long_long>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xf8,ERROR,
               "\"failed: expected \" \"\\\"1\\\"_kj.tryParseAs<unsigned long long>() == 1\", _kjCondition"
               ,(char (*) [62])"failed: expected \"1\"_kj.tryParseAs<unsigned long long>() == 1",
               (DebugComparison<kj::Maybe<unsigned_long_long>,_int> *)&local_98);
  }
  heapString(&local_68,"1",1);
  if ((anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_68.content.size_ !=
      (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x0) {
    local_38 = local_68.content.ptr;
  }
  local_48 = local_68.content.size_ +
             ((anon_union_8_1_a8c68091_for_NullableValue<double>_2)local_68.content.size_ ==
             (anon_union_8_1_a8c68091_for_NullableValue<double>_2)0x0);
  _local_50 = local_38;
  MVar11 = StringPtr::tryParseAs<int>((StringPtr *)local_40);
  local_98 = local_40[0];
  sVar1 = local_68.content.size_;
  pcVar16 = local_68.content.ptr;
  aVar20 = MVar11.ptr._0_4_;
  if (local_40[0] == '\x01') {
    local_40[0] = '\0';
    aVar20 = (anon_union_4_1_a8c68091_for_NullableValue<float>_2)local_40._4_4_;
  }
  if (local_98 != '\0') {
    local_94 = aVar20;
  }
  local_90._0_4_ = 1;
  local_88 = " == ";
  local_80 = &DAT_00000005;
  local_78 = CONCAT71(local_78._1_7_,
                      local_98 != '\0' &&
                      aVar20 == (anon_union_4_1_a8c68091_for_NullableValue<float>_2)0x1);
  if (local_68.content.ptr != (char *)0x0) {
    local_68.content.ptr = (char *)0x0;
    local_68.content.size_ = 0;
    (**(local_68.content.disposer)->_vptr_ArrayDisposer)
              (local_68.content.disposer,pcVar16,1,sVar1,sVar1,0);
  }
  if (((bool)(undefined1)local_78 == false) && (Debug::minSeverity < 3)) {
    Debug::log<char_const(&)[56],kj::_::DebugComparison<kj::Maybe<int>,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/string-test.c++"
               ,0xfa,ERROR,
               "\"failed: expected \" \"heapString(\\\"1\\\").tryParseAs<int>() == 1\", _kjCondition"
               ,(char (*) [56])"failed: expected heapString(\"1\").tryParseAs<int>() == 1",
               (DebugComparison<kj::Maybe<int>,_int> *)&local_98);
  }
  return;
}

Assistant:

TEST(String, tryParseAs) {
  KJ_EXPECT("0"_kj.tryParseAs<double>() == 0.0);
  KJ_EXPECT("0"_kj.tryParseAs<double>() == 0.0);
  KJ_EXPECT("0.0"_kj.tryParseAs<double>() == 0.0);
  KJ_EXPECT("1"_kj.tryParseAs<double>() == 1.0);
  KJ_EXPECT("1.0"_kj.tryParseAs<double>() == 1.0);
  KJ_EXPECT("1e100"_kj.tryParseAs<double>() == 1e100);
  KJ_EXPECT("inf"_kj.tryParseAs<double>() == inf());
  KJ_EXPECT("infinity"_kj.tryParseAs<double>() == inf());
  KJ_EXPECT("INF"_kj.tryParseAs<double>() == inf());
  KJ_EXPECT("INFINITY"_kj.tryParseAs<double>() == inf());
  KJ_EXPECT("1e100000"_kj.tryParseAs<double>() == inf());
  KJ_EXPECT("-inf"_kj.tryParseAs<double>() == -inf());
  KJ_EXPECT("-infinity"_kj.tryParseAs<double>() == -inf());
  KJ_EXPECT("-INF"_kj.tryParseAs<double>() == -inf());
  KJ_EXPECT("-INFINITY"_kj.tryParseAs<double>() == -inf());
  KJ_EXPECT("-1e100000"_kj.tryParseAs<double>() == -inf());
  KJ_EXPECT(isNaN("nan"_kj.tryParseAs<double>().orDefault(0.0)) == true);
  KJ_EXPECT(isNaN("NAN"_kj.tryParseAs<double>().orDefault(0.0)) == true);
  KJ_EXPECT(isNaN("NaN"_kj.tryParseAs<double>().orDefault(0.0)) == true);
  KJ_EXPECT(""_kj.tryParseAs<double>() == kj::none);
  KJ_EXPECT("a"_kj.tryParseAs<double>() == kj::none);
  KJ_EXPECT("1a"_kj.tryParseAs<double>() == kj::none);
  KJ_EXPECT("+-1"_kj.tryParseAs<double>() == kj::none);

  KJ_EXPECT("1"_kj.tryParseAs<float>() == 1.0);

  KJ_EXPECT("1"_kj.tryParseAs<int64_t>() == 1);
  KJ_EXPECT("9223372036854775807"_kj.tryParseAs<int64_t>() == 9223372036854775807LL);
  KJ_EXPECT("-9223372036854775808"_kj.tryParseAs<int64_t>() == -9223372036854775808ULL);
  KJ_EXPECT("9223372036854775808"_kj.tryParseAs<int64_t>() == kj::none);
  KJ_EXPECT("-9223372036854775809"_kj.tryParseAs<int64_t>() == kj::none);
  KJ_EXPECT(""_kj.tryParseAs<int64_t>() == kj::none);
  KJ_EXPECT("a"_kj.tryParseAs<int64_t>() == kj::none);
  KJ_EXPECT("1a"_kj.tryParseAs<int64_t>() == kj::none);
  KJ_EXPECT("+-1"_kj.tryParseAs<int64_t>() == kj::none);
  KJ_EXPECT("010"_kj.tryParseAs<int64_t>() == 10);
  KJ_EXPECT("0010"_kj.tryParseAs<int64_t>() == 10);
  KJ_EXPECT("0x10"_kj.tryParseAs<int64_t>() == 16);
  KJ_EXPECT("0X10"_kj.tryParseAs<int64_t>() == 16);
  KJ_EXPECT("-010"_kj.tryParseAs<int64_t>() == -10);
  KJ_EXPECT("-0x10"_kj.tryParseAs<int64_t>() == -16);
  KJ_EXPECT("-0X10"_kj.tryParseAs<int64_t>() == -16);

  KJ_EXPECT("1"_kj.tryParseAs<uint64_t>() == 1);
  KJ_EXPECT("0"_kj.tryParseAs<uint64_t>() == 0);
  KJ_EXPECT("18446744073709551615"_kj.tryParseAs<uint64_t>() == 18446744073709551615ULL);
  KJ_EXPECT("-1"_kj.tryParseAs<uint64_t>() == kj::none);
  KJ_EXPECT("18446744073709551616"_kj.tryParseAs<uint64_t>() == kj::none);
  KJ_EXPECT(""_kj.tryParseAs<uint64_t>() == kj::none);
  KJ_EXPECT("a"_kj.tryParseAs<uint64_t>() == kj::none);
  KJ_EXPECT("1a"_kj.tryParseAs<uint64_t>() == kj::none);
  KJ_EXPECT("+-1"_kj.tryParseAs<uint64_t>() == kj::none);

  KJ_EXPECT("1"_kj.tryParseAs<int32_t>() == 1);
  KJ_EXPECT("2147483647"_kj.tryParseAs<int32_t>() == 2147483647);
  KJ_EXPECT("-2147483648"_kj.tryParseAs<int32_t>() == -2147483648);
  KJ_EXPECT("2147483648"_kj.tryParseAs<int32_t>() == kj::none);
  KJ_EXPECT("-2147483649"_kj.tryParseAs<int32_t>() == kj::none);

  KJ_EXPECT("1"_kj.tryParseAs<uint32_t>() == 1);
  KJ_EXPECT("0"_kj.tryParseAs<uint32_t>() == 0U);
  KJ_EXPECT("4294967295"_kj.tryParseAs<uint32_t>() == 4294967295U);
  KJ_EXPECT("-1"_kj.tryParseAs<uint32_t>() == kj::none);
  KJ_EXPECT("4294967296"_kj.tryParseAs<uint32_t>() == kj::none);

  KJ_EXPECT("1"_kj.tryParseAs<int16_t>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<uint16_t>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<int8_t>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<uint8_t>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<char>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<signed char>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<unsigned char>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<short>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<unsigned short>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<int>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<unsigned>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<long>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<unsigned long>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<long long>() == 1);
  KJ_EXPECT("1"_kj.tryParseAs<unsigned long long>() == 1);

  KJ_EXPECT(heapString("1").tryParseAs<int>() == 1);
}